

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseMetaValue
          (AsciiParser *this,VariableDef *def,MetaVariable *outvar)

{
  bool bVar1;
  value_type *v;
  value_type *v_00;
  ostream *poVar2;
  string local_f390;
  string local_f370 [32];
  ostringstream local_f350 [8];
  ostringstream ss_e_115;
  string local_f1d8 [8];
  string tyname;
  ostringstream local_f198 [8];
  ostringstream ss_e_114;
  undefined1 local_f020 [8];
  Dictionary dict;
  ostringstream local_efd0 [8];
  ostringstream ss_e_113;
  undefined1 local_ee58 [8];
  AssetPath asset;
  ostringstream local_edf8 [8];
  ostringstream ss_e_112;
  undefined1 local_ec80 [8];
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> arrs;
  ostringstream local_ec48 [8];
  ostringstream ss_e_111;
  undefined1 local_ead0 [8];
  string str;
  ostringstream local_ea90 [8];
  ostringstream ss_e_110;
  undefined1 local_e918 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8e0 [39];
  allocator local_e8b9;
  string local_e8b8 [32];
  fmt local_e898 [32];
  ostringstream local_e878 [8];
  ostringstream ss_e_109;
  undefined1 local_e700 [8];
  texcoord3d val_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e6c8 [39];
  allocator local_e6a1;
  string local_e6a0 [32];
  fmt local_e680 [32];
  ostringstream local_e660 [8];
  ostringstream ss_e_108;
  undefined1 local_e4e8 [8];
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> vss_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e4b0 [39];
  allocator local_e489;
  string local_e488 [32];
  fmt local_e468 [32];
  ostringstream local_e448 [8];
  ostringstream ss_e_107;
  undefined1 local_e2cc [8];
  texcoord3f val_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e2a0 [39];
  allocator local_e279;
  string local_e278 [32];
  fmt local_e258 [32];
  ostringstream local_e238 [8];
  ostringstream ss_e_106;
  undefined1 local_e0c0 [8];
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> vss_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e088 [39];
  allocator local_e061;
  string local_e060 [32];
  fmt local_e040 [32];
  ostringstream local_e020 [8];
  ostringstream ss_e_105;
  texcoord3h local_dea6;
  undefined1 local_dea0 [2];
  texcoord3h val_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de80 [39];
  allocator local_de59;
  string local_de58 [32];
  fmt local_de38 [32];
  ostringstream local_de18 [8];
  ostringstream ss_e_104;
  undefined1 local_dca0 [8];
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> vss_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc68 [39];
  allocator local_dc41;
  string local_dc40 [32];
  fmt local_dc20 [32];
  ostringstream local_dc00 [8];
  ostringstream ss_e_103;
  undefined1 local_da88 [8];
  texcoord2d val_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da58 [39];
  allocator local_da31;
  string local_da30 [32];
  fmt local_da10 [32];
  ostringstream local_d9f0 [8];
  ostringstream ss_e_102;
  undefined1 local_d878 [8];
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> vss_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d840 [39];
  allocator local_d819;
  string local_d818 [32];
  fmt local_d7f8 [32];
  ostringstream local_d7d8 [8];
  ostringstream ss_e_101;
  texcoord2f local_d660;
  texcoord2f val_47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d638 [39];
  allocator local_d611;
  string local_d610 [32];
  fmt local_d5f0 [32];
  ostringstream local_d5d0 [8];
  ostringstream ss_e_100;
  undefined1 local_d458 [8];
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> vss_47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d420 [39];
  allocator local_d3f9;
  string local_d3f8 [32];
  fmt local_d3d8 [32];
  ostringstream local_d3b8 [8];
  ostringstream ss_e_99;
  texcoord2h local_d23c;
  undefined1 local_d238 [4];
  texcoord2h val_46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d218 [39];
  allocator local_d1f1;
  string local_d1f0 [32];
  fmt local_d1d0 [32];
  ostringstream local_d1b0 [8];
  ostringstream ss_e_98;
  undefined1 local_d038 [8];
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> vss_46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d000 [39];
  allocator local_cfd9;
  string local_cfd8 [32];
  fmt local_cfb8 [32];
  ostringstream local_cf98 [8];
  ostringstream ss_e_97;
  undefined1 local_ce20 [8];
  color4d val_45;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cde0 [39];
  allocator local_cdb9;
  string local_cdb8 [32];
  fmt local_cd98 [32];
  ostringstream local_cd78 [8];
  ostringstream ss_e_96;
  undefined1 local_cc00 [8];
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> vss_45;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cbc8 [39];
  allocator local_cba1;
  string local_cba0 [32];
  fmt local_cb80 [32];
  ostringstream local_cb60 [8];
  ostringstream ss_e_95;
  undefined1 local_c9e8 [8];
  color4f val_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c9b8 [39];
  allocator local_c991;
  string local_c990 [32];
  fmt local_c970 [32];
  ostringstream local_c950 [8];
  ostringstream ss_e_94;
  undefined1 local_c7d8 [8];
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> vss_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c7a0 [39];
  allocator local_c779;
  string local_c778 [32];
  fmt local_c758 [32];
  ostringstream local_c738 [8];
  ostringstream ss_e_93;
  undefined1 local_c5c0 [8];
  color3d val_43;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c588 [39];
  allocator local_c561;
  string local_c560 [32];
  fmt local_c540 [32];
  ostringstream local_c520 [8];
  ostringstream ss_e_92;
  undefined1 local_c3a8 [8];
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> vss_43;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c370 [39];
  allocator local_c349;
  string local_c348 [32];
  fmt local_c328 [32];
  ostringstream local_c308 [8];
  ostringstream ss_e_91;
  undefined1 local_c18c [8];
  color3f val_42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c160 [39];
  allocator local_c139;
  string local_c138 [32];
  fmt local_c118 [32];
  ostringstream local_c0f8 [8];
  ostringstream ss_e_90;
  undefined1 local_bf80 [8];
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> vss_42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf48 [39];
  allocator local_bf21;
  string local_bf20 [32];
  fmt local_bf00 [32];
  ostringstream local_bee0 [8];
  ostringstream ss_e_89;
  undefined1 local_bd68 [8];
  point3d val_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd30 [39];
  allocator local_bd09;
  string local_bd08 [32];
  fmt local_bce8 [32];
  ostringstream local_bcc8 [8];
  ostringstream ss_e_88;
  undefined1 local_bb50 [8];
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> vss_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb18 [39];
  allocator local_baf1;
  string local_baf0 [32];
  fmt local_bad0 [32];
  ostringstream local_bab0 [8];
  ostringstream ss_e_87;
  undefined1 local_b934 [8];
  point3f val_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b908 [39];
  allocator local_b8e1;
  string local_b8e0 [32];
  fmt local_b8c0 [32];
  ostringstream local_b8a0 [8];
  ostringstream ss_e_86;
  undefined1 local_b728 [8];
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> vss_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b6f0 [39];
  allocator local_b6c9;
  string local_b6c8 [32];
  fmt local_b6a8 [32];
  ostringstream local_b688 [8];
  ostringstream ss_e_85;
  point3h local_b50e;
  undefined1 local_b508 [2];
  point3h val_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b4e8 [39];
  allocator local_b4c1;
  string local_b4c0 [32];
  fmt local_b4a0 [32];
  ostringstream local_b480 [8];
  ostringstream ss_e_84;
  undefined1 local_b308 [8];
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> vss_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b2d0 [39];
  allocator local_b2a9;
  string local_b2a8 [32];
  fmt local_b288 [32];
  ostringstream local_b268 [8];
  ostringstream ss_e_83;
  undefined1 local_b0f0 [8];
  vector3d val_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0b8 [39];
  allocator local_b091;
  string local_b090 [32];
  fmt local_b070 [32];
  ostringstream local_b050 [8];
  ostringstream ss_e_82;
  undefined1 local_aed8 [8];
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> vss_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aea0 [39];
  allocator local_ae79;
  string local_ae78 [32];
  fmt local_ae58 [32];
  ostringstream local_ae38 [8];
  ostringstream ss_e_81;
  undefined1 local_acbc [8];
  vector3f val_37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac90 [39];
  allocator local_ac69;
  string local_ac68 [32];
  fmt local_ac48 [32];
  ostringstream local_ac28 [8];
  ostringstream ss_e_80;
  undefined1 local_aab0 [8];
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> vss_37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa78 [39];
  allocator local_aa51;
  string local_aa50 [32];
  fmt local_aa30 [32];
  ostringstream local_aa10 [8];
  ostringstream ss_e_79;
  vector3h local_a896;
  undefined1 local_a890 [2];
  vector3h val_36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a870 [39];
  allocator local_a849;
  string local_a848 [32];
  fmt local_a828 [32];
  ostringstream local_a808 [8];
  ostringstream ss_e_78;
  undefined1 local_a690 [8];
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> vss_36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a658 [39];
  allocator local_a631;
  string local_a630 [32];
  fmt local_a610 [32];
  ostringstream local_a5f0 [8];
  ostringstream ss_e_77;
  undefined1 local_a478 [8];
  normal3d val_35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a440 [39];
  allocator local_a419;
  string local_a418 [32];
  fmt local_a3f8 [32];
  ostringstream local_a3d8 [8];
  ostringstream ss_e_76;
  undefined1 local_a260 [8];
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> vss_35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a228 [39];
  allocator local_a201;
  string local_a200 [32];
  fmt local_a1e0 [32];
  ostringstream local_a1c0 [8];
  ostringstream ss_e_75;
  undefined1 local_a044 [8];
  normal3f val_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a018 [39];
  allocator local_9ff1;
  string local_9ff0 [32];
  fmt local_9fd0 [32];
  ostringstream local_9fb0 [8];
  ostringstream ss_e_74;
  undefined1 local_9e38 [8];
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> vss_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e00 [39];
  allocator local_9dd9;
  string local_9dd8 [32];
  fmt local_9db8 [32];
  ostringstream local_9d98 [8];
  ostringstream ss_e_73;
  normal3h local_9c1e;
  undefined1 local_9c18 [2];
  normal3h val_33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9bf8 [39];
  allocator local_9bd1;
  string local_9bd0 [32];
  fmt local_9bb0 [32];
  ostringstream local_9b90 [8];
  ostringstream ss_e_72;
  undefined1 local_9a18 [8];
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> vss_33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_99e0 [39];
  allocator local_99b9;
  string local_99b8 [32];
  fmt local_9998 [32];
  ostringstream local_9978 [8];
  ostringstream ss_e_71;
  undefined1 local_9800 [8];
  quatd val_32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_97c0 [39];
  allocator local_9799;
  string local_9798 [32];
  fmt local_9778 [32];
  ostringstream local_9758 [8];
  ostringstream ss_e_70;
  undefined1 local_95e0 [8];
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> vss_32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_95a8 [39];
  allocator local_9581;
  string local_9580 [32];
  fmt local_9560 [32];
  ostringstream local_9540 [8];
  ostringstream ss_e_69;
  undefined1 local_93c8 [8];
  quatf val_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9398 [39];
  allocator local_9371;
  string local_9370 [32];
  fmt local_9350 [32];
  ostringstream local_9330 [8];
  ostringstream ss_e_68;
  undefined1 local_91b8 [8];
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> vss_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9180 [39];
  allocator local_9159;
  string local_9158 [32];
  fmt local_9138 [32];
  ostringstream local_9118 [8];
  ostringstream ss_e_67;
  quath local_8fa0;
  quath val_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f78 [39];
  allocator local_8f51;
  string local_8f50 [32];
  fmt local_8f30 [32];
  ostringstream local_8f10 [8];
  ostringstream ss_e_66;
  undefined1 local_8d98 [8];
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> vss_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d60 [39];
  allocator local_8d39;
  string local_8d38 [32];
  fmt local_8d18 [32];
  ostringstream local_8cf8 [8];
  ostringstream ss_e_65;
  undefined1 local_8b80 [8];
  matrix4d val_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8ae0 [39];
  allocator local_8ab9;
  string local_8ab8 [32];
  fmt local_8a98 [32];
  ostringstream local_8a78 [8];
  ostringstream ss_e_64;
  undefined1 local_8900 [8];
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> vss_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88c8 [39];
  allocator local_88a1;
  string local_88a0 [32];
  fmt local_8880 [32];
  ostringstream local_8860 [8];
  ostringstream ss_e_63;
  undefined1 local_86e8 [8];
  matrix3d val_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8680 [39];
  allocator local_8659;
  string local_8658 [32];
  fmt local_8638 [32];
  ostringstream local_8618 [8];
  ostringstream ss_e_62;
  undefined1 local_84a0 [8];
  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> vss_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8468 [39];
  allocator local_8441;
  string local_8440 [32];
  fmt local_8420 [32];
  ostringstream local_8400 [8];
  ostringstream ss_e_61;
  undefined1 local_8288 [8];
  matrix2d val_27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8248 [39];
  allocator local_8221;
  string local_8220 [32];
  fmt local_8200 [32];
  ostringstream local_81e0 [8];
  ostringstream ss_e_60;
  undefined1 local_8068 [8];
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> vss_27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8030 [39];
  allocator local_8009;
  string local_8008 [32];
  fmt local_7fe8 [32];
  ostringstream local_7fc8 [8];
  ostringstream ss_e_59;
  undefined1 local_7e50 [8];
  matrix4f val_26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7df0 [39];
  allocator local_7dc9;
  string local_7dc8 [32];
  fmt local_7da8 [32];
  ostringstream local_7d88 [8];
  ostringstream ss_e_58;
  undefined1 local_7c10 [8];
  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> vss_26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7bd8 [39];
  allocator local_7bb1;
  string local_7bb0 [32];
  fmt local_7b90 [32];
  ostringstream local_7b70 [8];
  ostringstream ss_e_57;
  undefined1 local_79f4 [8];
  matrix3f val_25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_79b0 [39];
  allocator local_7989;
  string local_7988 [32];
  fmt local_7968 [32];
  ostringstream local_7948 [8];
  ostringstream ss_e_56;
  undefined1 local_77d0 [8];
  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> vss_25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7798 [39];
  allocator local_7771;
  string local_7770 [32];
  fmt local_7750 [32];
  ostringstream local_7730 [8];
  ostringstream ss_e_55;
  undefined1 local_75b8 [8];
  matrix2f val_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7588 [39];
  allocator local_7561;
  string local_7560 [32];
  fmt local_7540 [32];
  ostringstream local_7520 [8];
  ostringstream ss_e_54;
  undefined1 local_73a8 [8];
  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> vss_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7370 [39];
  allocator local_7349;
  string local_7348 [32];
  fmt local_7328 [32];
  ostringstream local_7308 [8];
  ostringstream ss_e_53;
  undefined1 local_7190 [8];
  double4 val_23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7150 [39];
  allocator local_7129;
  string local_7128 [32];
  fmt local_7108 [32];
  ostringstream local_70e8 [8];
  ostringstream ss_e_52;
  undefined1 local_6f70 [8];
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> vss_23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f38 [39];
  allocator local_6f11;
  string local_6f10 [32];
  fmt local_6ef0 [32];
  ostringstream local_6ed0 [8];
  ostringstream ss_e_51;
  undefined1 local_6d58 [8];
  double3 val_22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d20 [39];
  allocator local_6cf9;
  string local_6cf8 [32];
  fmt local_6cd8 [32];
  ostringstream local_6cb8 [8];
  ostringstream ss_e_50;
  undefined1 local_6b40 [8];
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> vss_22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b08 [39];
  allocator local_6ae1;
  string local_6ae0 [32];
  fmt local_6ac0 [32];
  ostringstream local_6aa0 [8];
  ostringstream ss_e_49;
  undefined1 local_6928 [8];
  double2 val_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68f8 [39];
  allocator local_68d1;
  string local_68d0 [32];
  fmt local_68b0 [32];
  ostringstream local_6890 [8];
  ostringstream ss_e_48;
  undefined1 local_6718 [8];
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> vss_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_66e0 [39];
  allocator local_66b9;
  string local_66b8 [32];
  fmt local_6698 [32];
  ostringstream local_6678 [8];
  ostringstream ss_e_47;
  double local_6500;
  double val_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_64d8 [39];
  allocator local_64b1;
  string local_64b0 [32];
  fmt local_6490 [32];
  ostringstream local_6470 [8];
  ostringstream ss_e_46;
  undefined1 local_62f8 [8];
  vector<double,_std::allocator<double>_> vss_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_62c0 [39];
  allocator local_6299;
  string local_6298 [32];
  fmt local_6278 [32];
  ostringstream local_6258 [8];
  ostringstream ss_e_45;
  undefined1 local_60e0 [8];
  float4 val_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60b0 [39];
  allocator local_6089;
  string local_6088 [32];
  fmt local_6068 [32];
  ostringstream local_6048 [8];
  ostringstream ss_e_44;
  undefined1 local_5ed0 [8];
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> vss_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e98 [39];
  allocator local_5e71;
  string local_5e70 [32];
  fmt local_5e50 [32];
  ostringstream local_5e30 [8];
  ostringstream ss_e_43;
  undefined1 local_5cb4 [8];
  float3 val_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c88 [39];
  allocator local_5c61;
  string local_5c60 [32];
  fmt local_5c40 [32];
  ostringstream local_5c20 [8];
  ostringstream ss_e_42;
  undefined1 local_5aa8 [8];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> vss_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a70 [39];
  allocator local_5a49;
  string local_5a48 [32];
  fmt local_5a28 [32];
  ostringstream local_5a08 [8];
  ostringstream ss_e_41;
  float2 local_5890;
  float2 val_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5868 [39];
  allocator local_5841;
  string local_5840 [32];
  fmt local_5820 [32];
  ostringstream local_5800 [8];
  ostringstream ss_e_40;
  undefined1 local_5688 [8];
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> vss_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5650 [39];
  allocator local_5629;
  string local_5628 [32];
  fmt local_5608 [32];
  ostringstream local_55e8 [8];
  ostringstream ss_e_39;
  float local_546c;
  undefined1 local_5468 [4];
  float val_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5448 [39];
  allocator local_5421;
  string local_5420 [32];
  fmt local_5400 [32];
  ostringstream local_53e0 [8];
  ostringstream ss_e_38;
  undefined1 local_5268 [8];
  vector<float,_std::allocator<float>_> vss_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5230 [39];
  allocator local_5209;
  string local_5208 [32];
  fmt local_51e8 [32];
  ostringstream local_51c8 [8];
  ostringstream ss_e_37;
  uint64_t local_5050;
  uint64_t val_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5028 [39];
  allocator local_5001;
  string local_5000 [32];
  fmt local_4fe0 [32];
  ostringstream local_4fc0 [8];
  ostringstream ss_e_36;
  undefined1 local_4e48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vss_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e10 [39];
  allocator local_4de9;
  string local_4de8 [32];
  fmt local_4dc8 [32];
  ostringstream local_4da8 [8];
  ostringstream ss_e_35;
  int64_t local_4c30;
  int64_t val_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c08 [39];
  allocator local_4be1;
  string local_4be0 [32];
  fmt local_4bc0 [32];
  ostringstream local_4ba0 [8];
  ostringstream ss_e_34;
  undefined1 local_4a28 [8];
  vector<long,_std::allocator<long>_> vss_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_49f0 [39];
  allocator local_49c9;
  string local_49c8 [32];
  fmt local_49a8 [32];
  ostringstream local_4988 [8];
  ostringstream ss_e_33;
  undefined1 local_4810 [8];
  uint4 val_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_47e0 [39];
  allocator local_47b9;
  string local_47b8 [32];
  fmt local_4798 [32];
  ostringstream local_4778 [8];
  ostringstream ss_e_32;
  undefined1 local_4600 [8];
  vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> vss_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_45c8 [39];
  allocator local_45a1;
  string local_45a0 [32];
  fmt local_4580 [32];
  ostringstream local_4560 [8];
  ostringstream ss_e_31;
  undefined1 local_43e4 [8];
  uint3 val_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_43b8 [39];
  allocator local_4391;
  string local_4390 [32];
  fmt local_4370 [32];
  ostringstream local_4350 [8];
  ostringstream ss_e_30;
  undefined1 local_41d8 [8];
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> vss_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_41a0 [39];
  allocator local_4179;
  string local_4178 [32];
  fmt local_4158 [32];
  ostringstream local_4138 [8];
  ostringstream ss_e_29;
  uint2 local_3fc0;
  uint2 val_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f98 [39];
  allocator local_3f71;
  string local_3f70 [32];
  fmt local_3f50 [32];
  ostringstream local_3f30 [8];
  ostringstream ss_e_28;
  undefined1 local_3db8 [8];
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> vss_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d80 [39];
  allocator local_3d59;
  string local_3d58 [32];
  fmt local_3d38 [32];
  ostringstream local_3d18 [8];
  ostringstream ss_e_27;
  undefined1 local_3ba0 [8];
  int4 val_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b70 [39];
  allocator local_3b49;
  string local_3b48 [32];
  fmt local_3b28 [32];
  ostringstream local_3b08 [8];
  ostringstream ss_e_26;
  undefined1 local_3990 [8];
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> vss_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3958 [39];
  allocator local_3931;
  string local_3930 [32];
  fmt local_3910 [32];
  ostringstream local_38f0 [8];
  ostringstream ss_e_25;
  undefined1 local_3774 [8];
  int3 val_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3748 [39];
  allocator local_3721;
  string local_3720 [32];
  fmt local_3700 [32];
  ostringstream local_36e0 [8];
  ostringstream ss_e_24;
  undefined1 local_3568 [8];
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> vss_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3530 [39];
  allocator local_3509;
  string local_3508 [32];
  fmt local_34e8 [32];
  ostringstream local_34c8 [8];
  ostringstream ss_e_23;
  int2 local_3350;
  int2 val_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3328 [39];
  allocator local_3301;
  string local_3300 [32];
  fmt local_32e0 [32];
  ostringstream local_32c0 [8];
  ostringstream ss_e_22;
  undefined1 local_3148 [8];
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> vss_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3110 [39];
  allocator local_30e9;
  string local_30e8 [32];
  fmt local_30c8 [32];
  ostringstream local_30a8 [8];
  ostringstream ss_e_21;
  uint32_t local_2f2c;
  undefined1 local_2f28 [4];
  uint32_t val_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f08 [39];
  allocator local_2ee1;
  string local_2ee0 [32];
  fmt local_2ec0 [32];
  ostringstream local_2ea0 [8];
  ostringstream ss_e_20;
  undefined1 local_2d28 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vss_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2cf0 [39];
  allocator local_2cc9;
  string local_2cc8 [32];
  fmt local_2ca8 [32];
  ostringstream local_2c88 [8];
  ostringstream ss_e_19;
  int local_2b0c;
  undefined1 local_2b08 [4];
  int32_t val_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ae8 [39];
  allocator local_2ac1;
  string local_2ac0 [32];
  fmt local_2aa0 [32];
  ostringstream local_2a80 [8];
  ostringstream ss_e_18;
  undefined1 local_2908 [8];
  vector<int,_std::allocator<int>_> vss_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28d0 [39];
  allocator local_28a9;
  string local_28a8 [32];
  fmt local_2888 [32];
  ostringstream local_2868 [8];
  ostringstream ss_e_17;
  half4 local_26f0;
  half4 val_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26c8 [39];
  allocator local_26a1;
  string local_26a0 [32];
  fmt local_2680 [32];
  ostringstream local_2660 [8];
  ostringstream ss_e_16;
  undefined1 local_24e8 [8];
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  vss_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24b0 [39];
  allocator local_2489;
  string local_2488 [32];
  fmt local_2468 [32];
  ostringstream local_2448 [8];
  ostringstream ss_e_15;
  half3 local_22ce;
  undefined1 local_22c8 [2];
  half3 val_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22a8 [39];
  allocator local_2281;
  string local_2280 [32];
  fmt local_2260 [32];
  ostringstream local_2240 [8];
  ostringstream ss_e_14;
  undefined1 local_20c8 [8];
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  vss_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2090 [39];
  allocator local_2069;
  string local_2068 [32];
  fmt local_2048 [32];
  ostringstream local_2028 [8];
  ostringstream ss_e_13;
  half2 local_1eac;
  undefined1 local_1ea8 [4];
  half2 val_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e88 [39];
  allocator local_1e61;
  string local_1e60 [32];
  fmt local_1e40 [32];
  ostringstream local_1e20 [8];
  ostringstream ss_e_12;
  undefined1 local_1ca8 [8];
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  vss_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c70 [39];
  allocator local_1c49;
  string local_1c48 [32];
  fmt local_1c28 [32];
  ostringstream local_1c08 [8];
  ostringstream ss_e_11;
  half local_1a8a;
  undefined1 local_1a88 [6];
  half val_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a68 [39];
  allocator local_1a41;
  string local_1a40 [32];
  fmt local_1a20 [32];
  ostringstream local_1a00 [8];
  ostringstream ss_e_10;
  undefined1 local_1888 [8];
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> vss_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1850 [39];
  allocator local_1829;
  string local_1828 [32];
  fmt local_1808 [32];
  ostringstream local_17e8 [8];
  ostringstream ss_e_9;
  bool local_1669;
  undefined1 local_1668 [7];
  bool val_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1648 [39];
  allocator local_1621;
  string local_1620 [32];
  fmt local_1600 [32];
  ostringstream local_15e0 [8];
  ostringstream ss_e_8;
  undefined1 local_1468 [8];
  vector<bool,_std::allocator<bool>_> vss_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1420 [39];
  allocator local_13f9;
  string local_13f8 [32];
  fmt local_13d8 [32];
  ostringstream local_13b8 [8];
  ostringstream ss_e_7;
  undefined1 local_1240 [8];
  token val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1200 [39];
  allocator local_11d9;
  string local_11d8 [32];
  fmt local_11b8 [32];
  ostringstream local_1198 [8];
  ostringstream ss_e_6;
  undefined1 local_1020 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> vss;
  allocator local_fe1;
  string local_fe0 [32];
  fmt local_fc0 [32];
  ostringstream local_fa0 [8];
  ostringstream ss_e_5;
  undefined1 local_e28 [8];
  Path path;
  allocator local_d31;
  string local_d30 [32];
  fmt local_d10 [32];
  ostringstream local_cf0 [8];
  ostringstream ss_e_4;
  undefined1 local_b78 [8];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> paths;
  string local_b58;
  allocator local_b31;
  string local_b30 [32];
  fmt local_b10 [32];
  ostringstream local_af0 [8];
  ostringstream ss_e_3;
  undefined1 local_978 [8];
  optional<tinyusdz::Payload> ref_1;
  allocator local_829;
  string local_828 [32];
  fmt local_808 [32];
  ostringstream local_7e8 [8];
  ostringstream ss_e_2;
  undefined1 local_670 [8];
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> refs_1;
  string local_650;
  allocator local_629;
  string local_628 [32];
  fmt local_608 [32];
  ostringstream local_5e8 [8];
  ostringstream ss_e_1;
  undefined1 local_470 [8];
  optional<tinyusdz::Reference> ref;
  string local_310;
  allocator local_2e9;
  string local_2e8 [32];
  fmt local_2c8 [32];
  ostringstream local_2a8 [8];
  ostringstream ss_e;
  undefined1 local_130 [8];
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> refs;
  uint32_t tyid;
  char c;
  string local_f0;
  allocator local_c9;
  string local_c8;
  byte local_a1;
  undefined1 local_a0 [7];
  bool array_qual;
  MetaVariable var;
  string varname;
  string vartype;
  MetaVariable *outvar_local;
  VariableDef *def_local;
  AsciiParser *this_local;
  
  ::std::__cxx11::string::string((string *)(varname.field_2._M_local_buf + 8),(string *)def);
  ::std::__cxx11::string::string
            ((string *)(var._name.field_2._M_local_buf + 8),(string *)&def->name);
  MetaVariable::MetaVariable((MetaVariable *)local_a0);
  local_a1 = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_c8,"[]",&local_c9);
  bVar1 = endsWith((string *)((long)&varname.field_2 + 8),&local_c8);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&tyid,"[]",
               (allocator *)
               ((long)&refs.
                       super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    removeSuffix(&local_f0,(string *)((long)&varname.field_2 + 8),(string *)&tyid);
    ::std::__cxx11::string::operator=
              ((string *)(varname.field_2._M_local_buf + 8),(string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&tyid);
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&refs.
                       super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_a1 = 1;
  }
  else if ((((def->allow_array_type & 1U) != 0) &&
           (bVar1 = LookChar1(this,(char *)((long)&refs.
                                                  super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 6)), bVar1)) &&
          (refs.super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ == '[')) {
    local_a1 = 1;
  }
  refs.super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       tinyusdz::value::GetTypeId((string *)((long)&varname.field_2 + 8));
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (varname.field_2._M_local_buf + 8),"Reference");
  if (bVar1) {
    if ((local_a1 & 1) == 0) {
      nonstd::optional_lite::optional<tinyusdz::Reference>::optional
                ((optional<tinyusdz::Reference> *)local_470);
      bVar1 = ReadBasicType(this,(optional<tinyusdz::Reference> *)local_470);
      if (bVar1) {
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_470);
        if (bVar1) {
          v = nonstd::optional_lite::optional<tinyusdz::Reference>::value
                        ((optional<tinyusdz::Reference> *)local_470);
          MetaVariable::set_value<tinyusdz::Reference>((MetaVariable *)local_a0,v);
        }
        else {
          MetaVariable::set_value<tinyusdz::value::ValueBlock>
                    ((MetaVariable *)local_a0,
                     (ValueBlock *)
                     ((long)&refs_1.
                             super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        }
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_5e8);
        poVar2 = ::std::operator<<((ostream *)local_5e8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[ASCII]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa8c);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_628,"Failed to parse `{}` in Prim metadataum.",&local_629);
        fmt::format<std::__cxx11::string>
                  (local_608,(string *)local_628,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&def->name);
        poVar2 = ::std::operator<<((ostream *)local_5e8,(string *)local_608);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_608);
        ::std::__cxx11::string::~string(local_628);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_629);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_650);
        ::std::__cxx11::string::~string((string *)&local_650);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_5e8);
      }
      nonstd::optional_lite::optional<tinyusdz::Reference>::~optional
                ((optional<tinyusdz::Reference> *)local_470);
    }
    else {
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::vector
                ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)local_130);
      bVar1 = ParseBasicTypeArray<tinyusdz::Reference>
                        (this,(vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)
                              local_130);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)local_130);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_2a8);
        poVar2 = ::std::operator<<((ostream *)local_2a8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[ASCII]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa84);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2e8,"Failed to parse `{}` in Prim metadataum.",&local_2e9);
        fmt::format<std::__cxx11::string>
                  (local_2c8,(string *)local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&def->name);
        poVar2 = ::std::operator<<((ostream *)local_2a8,(string *)local_2c8);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_2c8);
        ::std::__cxx11::string::~string(local_2e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_310);
        ::std::__cxx11::string::~string((string *)&local_310);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_2a8);
      }
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector
                ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)local_130);
    }
    goto joined_r0x004f0ae4;
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (varname.field_2._M_local_buf + 8),"Payload");
  if (bVar1) {
    if ((local_a1 & 1) == 0) {
      nonstd::optional_lite::optional<tinyusdz::Payload>::optional
                ((optional<tinyusdz::Payload> *)local_978);
      bVar1 = ReadBasicType(this,(optional<tinyusdz::Payload> *)local_978);
      if (bVar1) {
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_978);
        if (bVar1) {
          v_00 = nonstd::optional_lite::optional<tinyusdz::Payload>::value
                           ((optional<tinyusdz::Payload> *)local_978);
          MetaVariable::set_value<tinyusdz::Payload>((MetaVariable *)local_a0,v_00);
        }
        else {
          MetaVariable::set_value<tinyusdz::value::ValueBlock>
                    ((MetaVariable *)local_a0,
                     (ValueBlock *)
                     ((long)&paths.
                             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        }
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_af0);
        poVar2 = ::std::operator<<((ostream *)local_af0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[ASCII]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xaa3);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_b30,"Failed to parse `{}` in Prim metadataum.",&local_b31);
        fmt::format<std::__cxx11::string>
                  (local_b10,(string *)local_b30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&def->name);
        poVar2 = ::std::operator<<((ostream *)local_af0,(string *)local_b10);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_b10);
        ::std::__cxx11::string::~string(local_b30);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b31);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_b58);
        ::std::__cxx11::string::~string((string *)&local_b58);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_af0);
      }
      nonstd::optional_lite::optional<tinyusdz::Payload>::~optional
                ((optional<tinyusdz::Payload> *)local_978);
    }
    else {
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_670);
      bVar1 = ParseBasicTypeArray<tinyusdz::Payload>
                        (this,(vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                              local_670);
      if (bVar1) {
        MetaVariable::set_value<std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_670);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_7e8);
        poVar2 = ::std::operator<<((ostream *)local_7e8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[ASCII]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa9b);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_828,"Failed to parse `{}` in Prim metadataum.",&local_829);
        fmt::format<std::__cxx11::string>
                  (local_808,(string *)local_828,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&def->name);
        poVar2 = ::std::operator<<((ostream *)local_7e8,(string *)local_808);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_808);
        ::std::__cxx11::string::~string(local_828);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_829);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)((long)&ref_1.contained + 0x118));
        ::std::__cxx11::string::~string((string *)((long)&ref_1.contained + 0x118));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_7e8);
      }
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_670);
    }
    goto joined_r0x004f0ae4;
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (varname.field_2._M_local_buf + 8),"Path");
  if (bVar1) {
    if ((local_a1 & 1) == 0) {
      Path::Path((Path *)local_e28);
      bVar1 = ReadBasicType(this,(Path *)local_e28);
      if (bVar1) {
        MetaVariable::set_value<tinyusdz::Path>((MetaVariable *)local_a0,(Path *)local_e28);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_fa0);
        poVar2 = ::std::operator<<((ostream *)local_fa0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[ASCII]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xabb);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_fe0,"Failed to parse `{}` in Prim metadatum.",&local_fe1);
        fmt::format<std::__cxx11::string>
                  (local_fc0,(string *)local_fe0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&def->name);
        poVar2 = ::std::operator<<((ostream *)local_fa0,(string *)local_fc0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_fc0);
        ::std::__cxx11::string::~string(local_fe0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_fe1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)
                       &vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string
                  ((string *)
                   &vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_fa0);
      }
      Path::~Path((Path *)local_e28);
    }
    else {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b78);
      bVar1 = ParseBasicTypeArray<tinyusdz::Path>
                        (this,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b78);
      if (bVar1) {
        MetaVariable::set_value<std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b78);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_cf0);
        poVar2 = ::std::operator<<((ostream *)local_cf0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[ASCII]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xab2);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_d30,"Failed to parse `{}` in Prim metadatum.",&local_d31);
        fmt::format<std::__cxx11::string>
                  (local_d10,(string *)local_d30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&def->name);
        poVar2 = ::std::operator<<((ostream *)local_cf0,(string *)local_d10);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_d10);
        ::std::__cxx11::string::~string(local_d30);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d31);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&path._valid);
        ::std::__cxx11::string::~string((string *)&path._valid);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_cf0);
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b78);
    }
    goto joined_r0x004f0ae4;
  }
  switch((uint32_t)
         refs.super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
  case 6:
    if ((local_a1 & 1) == 0) {
      Token::Token((Token *)local_1240);
      bVar1 = ReadBasicType(this,(token *)local_1240);
      if (bVar1) {
        MetaVariable::set_value<tinyusdz::Token>((MetaVariable *)local_a0,(Token *)local_1240);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_13b8);
        poVar2 = ::std::operator<<((ostream *)local_13b8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_13f8,"Failed to parse a value of type `{}`",&local_13f9);
        tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_13d8,(string *)local_13f8,local_1420);
        poVar2 = ::std::operator<<((ostream *)local_13b8,(string *)local_13d8);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_13d8);
        ::std::__cxx11::string::~string((string *)local_1420);
        ::std::__cxx11::string::~string(local_13f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_13f9);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)
                       &vss_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string
                  ((string *)
                   &vss_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_13b8);
      }
      Token::~Token((Token *)local_1240);
    }
    else {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_1020);
      bVar1 = ParseBasicTypeArray<tinyusdz::Token>
                        (this,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                              local_1020);
      if (bVar1) {
        MetaVariable::set_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_1020);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1198);
        poVar2 = ::std::operator<<((ostream *)local_1198,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_11d8,"Failed to parse a value of type `{}[]`",&local_11d9);
        tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_11b8,(string *)local_11d8,local_1200);
        poVar2 = ::std::operator<<((ostream *)local_1198,(string *)local_11b8);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_11b8);
        ::std::__cxx11::string::~string((string *)local_1200);
        ::std::__cxx11::string::~string(local_11d8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_11d9);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)((long)&val.str_.field_2 + 8));
        ::std::__cxx11::string::~string((string *)(val.str_.field_2._M_local_buf + 8));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1198);
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_1020);
    }
    goto joined_r0x004f0ae4;
  case 7:
    if ((local_a1 & 1) == 0) {
      ::std::__cxx11::string::string((string *)local_ead0);
      bVar1 = ReadBasicType(this,(string *)local_ead0);
      if (bVar1) {
        MetaVariable::set_value<std::__cxx11::string>
                  ((MetaVariable *)local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ead0);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_ec48);
        poVar2 = ::std::operator<<((ostream *)local_ec48,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xacc);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_ec48,"Failed to parse `string`");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)
                       &arrs.
                        super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string
                  ((string *)
                   &arrs.
                    super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_ec48);
      }
      ::std::__cxx11::string::~string((string *)local_ead0);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_e918);
      bVar1 = ParseBasicTypeArray<std::__cxx11::string>
                        (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_e918);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e918);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_ea90);
        poVar2 = ::std::operator<<((ostream *)local_ea90,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac6);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_ea90,"Failed to parse `string[]`");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)((long)&str.field_2 + 8));
        ::std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_ea90);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e918);
    }
    goto joined_r0x004f0ae4;
  default:
    ::std::__cxx11::string::string(local_f1d8,(string *)(varname.field_2._M_local_buf + 8));
    if ((local_a1 & 1) != 0) {
      ::std::__cxx11::string::operator+=(local_f1d8,"[]");
    }
    ::std::__cxx11::ostringstream::ostringstream(local_f350);
    poVar2 = ::std::operator<<((ostream *)local_f350,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xaf2);
    ::std::operator<<(poVar2," ");
    ::std::operator+((char *)local_f370,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Unsupported or invalid type for Metadatum:");
    poVar2 = ::std::operator<<((ostream *)local_f350,local_f370);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string(local_f370);
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_f390);
    ::std::__cxx11::string::~string((string *)&local_f390);
    this_local._7_1_ = 0;
    ref.contained._332_4_ = 1;
    ::std::__cxx11::ostringstream::~ostringstream(local_f350);
    ::std::__cxx11::string::~string(local_f1d8);
    goto joined_r0x004f0ae4;
  case 9:
    if ((local_a1 & 1) != 0) {
      ::std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_1468);
      bVar1 = ParseBasicTypeArray<bool>(this,(vector<bool,_std::allocator<bool>_> *)local_1468);
      if (bVar1) {
        MetaVariable::set_value<std::vector<bool,std::allocator<bool>>>
                  ((MetaVariable *)local_a0,(vector<bool,_std::allocator<bool>_> *)local_1468);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_15e0);
        poVar2 = ::std::operator<<((ostream *)local_15e0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1620,"Failed to parse a value of type `{}[]`",&local_1621);
        tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_1600,(string *)local_1620,local_1648);
        poVar2 = ::std::operator<<((ostream *)local_15e0,(string *)local_1600);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_1600);
        ::std::__cxx11::string::~string((string *)local_1648);
        ::std::__cxx11::string::~string(local_1620);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1621);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_1668);
        ::std::__cxx11::string::~string((string *)local_1668);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_15e0);
      }
      ::std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_1468);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_1669);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_17e8);
      poVar2 = ::std::operator<<((ostream *)local_17e8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1828,"Failed to parse a value of type `{}`",&local_1829);
      tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_1808,(string *)local_1828,local_1850);
      poVar2 = ::std::operator<<((ostream *)local_17e8,(string *)local_1808);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_1808);
      ::std::__cxx11::string::~string((string *)local_1850);
      ::std::__cxx11::string::~string(local_1828);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1829);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_2.
                      super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_2.
                  super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_17e8);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<bool>((MetaVariable *)local_a0,&local_1669);
    break;
  case 0xe:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)local_1888
                );
      bVar1 = ParseBasicTypeArray<tinyusdz::value::half>
                        (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                               *)local_1888);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   local_1888);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a00);
        poVar2 = ::std::operator<<((ostream *)local_1a00,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1a40,"Failed to parse a value of type `{}[]`",&local_1a41);
        tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_1a20,(string *)local_1a40,local_1a68);
        poVar2 = ::std::operator<<((ostream *)local_1a00,(string *)local_1a20);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_1a20);
        ::std::__cxx11::string::~string((string *)local_1a68);
        ::std::__cxx11::string::~string(local_1a40);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1a41);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_1a88);
        ::std::__cxx11::string::~string((string *)local_1a88);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1a00);
      }
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~vector
                ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)local_1888
                );
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_1a8a);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_1c08);
      poVar2 = ::std::operator<<((ostream *)local_1c08,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c48,"Failed to parse a value of type `{}`",&local_1c49);
      tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_1c28,(string *)local_1c48,local_1c70);
      poVar2 = ::std::operator<<((ostream *)local_1c08,(string *)local_1c28);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_1c28);
      ::std::__cxx11::string::~string((string *)local_1c70);
      ::std::__cxx11::string::~string(local_1c48);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1c49);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_3.
                      super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_3.
                  super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_1c08);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::half>((MetaVariable *)local_a0,&local_1a8a);
    break;
  case 0xf:
    if ((local_a1 & 1) != 0) {
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2908);
      bVar1 = ParseBasicTypeArray<int>(this,(vector<int,_std::allocator<int>_> *)local_2908);
      if (bVar1) {
        MetaVariable::set_value<std::vector<int,std::allocator<int>>>
                  ((MetaVariable *)local_a0,(vector<int,_std::allocator<int>_> *)local_2908);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_2a80);
        poVar2 = ::std::operator<<((ostream *)local_2a80,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2ac0,"Failed to parse a value of type `{}[]`",&local_2ac1);
        tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_2aa0,(string *)local_2ac0,local_2ae8);
        poVar2 = ::std::operator<<((ostream *)local_2a80,(string *)local_2aa0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_2aa0);
        ::std::__cxx11::string::~string((string *)local_2ae8);
        ::std::__cxx11::string::~string(local_2ac0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2ac1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_2b08);
        ::std::__cxx11::string::~string((string *)local_2b08);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_2a80);
      }
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_2908);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_2b0c);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_2c88);
      poVar2 = ::std::operator<<((ostream *)local_2c88,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2cc8,"Failed to parse a value of type `{}`",&local_2cc9);
      tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_2ca8,(string *)local_2cc8,local_2cf0);
      poVar2 = ::std::operator<<((ostream *)local_2c88,(string *)local_2ca8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_2ca8);
      ::std::__cxx11::string::~string((string *)local_2cf0);
      ::std::__cxx11::string::~string(local_2cc8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2cc9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_2c88);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<int>((MetaVariable *)local_a0,&local_2b0c);
    break;
  case 0x10:
    if ((local_a1 & 1) != 0) {
      ::std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)local_4a28);
      bVar1 = ParseBasicTypeArray<long>(this,(vector<long,_std::allocator<long>_> *)local_4a28);
      if (bVar1) {
        MetaVariable::set_value<std::vector<long,std::allocator<long>>>
                  ((MetaVariable *)local_a0,(vector<long,_std::allocator<long>_> *)local_4a28);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4ba0);
        poVar2 = ::std::operator<<((ostream *)local_4ba0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_4be0,"Failed to parse a value of type `{}[]`",&local_4be1);
        tinyusdz::value::TypeTraits<long>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_4bc0,(string *)local_4be0,local_4c08);
        poVar2 = ::std::operator<<((ostream *)local_4ba0,(string *)local_4bc0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_4bc0);
        ::std::__cxx11::string::~string((string *)local_4c08);
        ::std::__cxx11::string::~string(local_4be0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_4be1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_14);
        ::std::__cxx11::string::~string((string *)&val_14);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_4ba0);
      }
      ::std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)local_4a28);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_4c30);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_4da8);
      poVar2 = ::std::operator<<((ostream *)local_4da8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4de8,"Failed to parse a value of type `{}`",&local_4de9);
      tinyusdz::value::TypeTraits<long>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_4dc8,(string *)local_4de8,local_4e10);
      poVar2 = ::std::operator<<((ostream *)local_4da8,(string *)local_4dc8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_4dc8);
      ::std::__cxx11::string::~string((string *)local_4e10);
      ::std::__cxx11::string::~string(local_4de8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4de9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_4da8);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<long>((MetaVariable *)local_a0,&local_4c30);
    break;
  case 0x11:
    if ((local_a1 & 1) != 0) {
      ::std::
      vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
      ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                *)local_1ca8);
      bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                        (this,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                               *)local_1ca8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)local_1ca8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1e20);
        poVar2 = ::std::operator<<((ostream *)local_1e20,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1e60,"Failed to parse a value of type `{}[]`",&local_1e61);
        tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_1e40,(string *)local_1e60,local_1e88);
        poVar2 = ::std::operator<<((ostream *)local_1e20,(string *)local_1e40);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_1e40);
        ::std::__cxx11::string::~string((string *)local_1e88);
        ::std::__cxx11::string::~string(local_1e60);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1e61);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_1ea8);
        ::std::__cxx11::string::~string((string *)local_1ea8);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1e20);
      }
      ::std::
      vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
      ::~vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                 *)local_1ca8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_1eac);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_2028);
      poVar2 = ::std::operator<<((ostream *)local_2028,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2068,"Failed to parse a value of type `{}`",&local_2069);
      tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,2ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_2048,(string *)local_2068,local_2090);
      poVar2 = ::std::operator<<((ostream *)local_2028,(string *)local_2048);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_2048);
      ::std::__cxx11::string::~string((string *)local_2090);
      ::std::__cxx11::string::~string(local_2068);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2069);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_4.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_4.
                  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_2028);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<tinyusdz::value::half,2ul>>
              ((MetaVariable *)local_a0,&local_1eac);
    break;
  case 0x12:
    if ((local_a1 & 1) != 0) {
      ::std::
      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)local_20c8);
      bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                        (this,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                               *)local_20c8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)local_20c8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_2240);
        poVar2 = ::std::operator<<((ostream *)local_2240,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2280,"Failed to parse a value of type `{}[]`",&local_2281);
        tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_2260,(string *)local_2280,local_22a8);
        poVar2 = ::std::operator<<((ostream *)local_2240,(string *)local_2260);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_2260);
        ::std::__cxx11::string::~string((string *)local_22a8);
        ::std::__cxx11::string::~string(local_2280);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2281);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_22c8);
        ::std::__cxx11::string::~string((string *)local_22c8);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_2240);
      }
      ::std::
      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 *)local_20c8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_22ce);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_2448);
      poVar2 = ::std::operator<<((ostream *)local_2448,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2488,"Failed to parse a value of type `{}`",&local_2489);
      tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,3ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_2468,(string *)local_2488,local_24b0);
      poVar2 = ::std::operator<<((ostream *)local_2448,(string *)local_2468);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_2468);
      ::std::__cxx11::string::~string((string *)local_24b0);
      ::std::__cxx11::string::~string(local_2488);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2489);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_5.
                      super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_5.
                  super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_2448);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<tinyusdz::value::half,3ul>>
              ((MetaVariable *)local_a0,&local_22ce);
    break;
  case 0x13:
    if ((local_a1 & 1) != 0) {
      ::std::
      vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
      ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                *)local_24e8);
      bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                        (this,(vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                               *)local_24e8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)local_24e8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_2660);
        poVar2 = ::std::operator<<((ostream *)local_2660,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_26a0,"Failed to parse a value of type `{}[]`",&local_26a1);
        tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_2680,(string *)local_26a0,local_26c8);
        poVar2 = ::std::operator<<((ostream *)local_2660,(string *)local_2680);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_2680);
        ::std::__cxx11::string::~string((string *)local_26c8);
        ::std::__cxx11::string::~string(local_26a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_26a1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_5);
        ::std::__cxx11::string::~string((string *)&val_5);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_2660);
      }
      ::std::
      vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
      ::~vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                 *)local_24e8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_26f0);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_2868);
      poVar2 = ::std::operator<<((ostream *)local_2868,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_28a8,"Failed to parse a value of type `{}`",&local_28a9);
      tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,4ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_2888,(string *)local_28a8,local_28d0);
      poVar2 = ::std::operator<<((ostream *)local_2868,(string *)local_2888);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_2888);
      ::std::__cxx11::string::~string((string *)local_28d0);
      ::std::__cxx11::string::~string(local_28a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_28a9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_2868);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<tinyusdz::value::half,4ul>>
              ((MetaVariable *)local_a0,&local_26f0);
    break;
  case 0x14:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
                ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)local_3148)
      ;
      bVar1 = ParseBasicTypeArray<std::array<int,2ul>>
                        (this,(vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                               *)local_3148);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                   local_3148);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_32c0);
        poVar2 = ::std::operator<<((ostream *)local_32c0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3300,"Failed to parse a value of type `{}[]`",&local_3301);
        tinyusdz::value::TypeTraits<std::array<int,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_32e0,(string *)local_3300,local_3328);
        poVar2 = ::std::operator<<((ostream *)local_32c0,(string *)local_32e0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_32e0);
        ::std::__cxx11::string::~string((string *)local_3328);
        ::std::__cxx11::string::~string(local_3300);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3301);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_8);
        ::std::__cxx11::string::~string((string *)&val_8);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_32c0);
      }
      ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~vector
                ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)local_3148)
      ;
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_3350);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_34c8);
      poVar2 = ::std::operator<<((ostream *)local_34c8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3508,"Failed to parse a value of type `{}`",&local_3509);
      tinyusdz::value::TypeTraits<std::array<int,2ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_34e8,(string *)local_3508,local_3530);
      poVar2 = ::std::operator<<((ostream *)local_34c8,(string *)local_34e8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_34e8);
      ::std::__cxx11::string::~string((string *)local_3530);
      ::std::__cxx11::string::~string(local_3508);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3509);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_9.
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_9.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_34c8);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<int,2ul>>((MetaVariable *)local_a0,&local_3350);
    break;
  case 0x15:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
                ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)local_3568)
      ;
      bVar1 = ParseBasicTypeArray<std::array<int,3ul>>
                        (this,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                               *)local_3568);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                   local_3568);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_36e0);
        poVar2 = ::std::operator<<((ostream *)local_36e0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3720,"Failed to parse a value of type `{}[]`",&local_3721);
        tinyusdz::value::TypeTraits<std::array<int,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_3700,(string *)local_3720,local_3748);
        poVar2 = ::std::operator<<((ostream *)local_36e0,(string *)local_3700);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_3700);
        ::std::__cxx11::string::~string((string *)local_3748);
        ::std::__cxx11::string::~string(local_3720);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3721);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_9._M_elems + 1));
        ::std::__cxx11::string::~string((string *)(val_9._M_elems + 1));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_36e0);
      }
      ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
                ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)local_3568)
      ;
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(int3 *)local_3774);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_38f0);
      poVar2 = ::std::operator<<((ostream *)local_38f0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3930,"Failed to parse a value of type `{}`",&local_3931);
      tinyusdz::value::TypeTraits<std::array<int,3ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_3910,(string *)local_3930,local_3958);
      poVar2 = ::std::operator<<((ostream *)local_38f0,(string *)local_3910);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_3910);
      ::std::__cxx11::string::~string((string *)local_3958);
      ::std::__cxx11::string::~string(local_3930);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3931);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_10.
                      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_10.
                  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_38f0);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<int,3ul>>
              ((MetaVariable *)local_a0,(array<int,_3UL> *)local_3774);
    break;
  case 0x16:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
                ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)local_3990)
      ;
      bVar1 = ParseBasicTypeArray<std::array<int,4ul>>
                        (this,(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                               *)local_3990);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                   local_3990);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_3b08);
        poVar2 = ::std::operator<<((ostream *)local_3b08,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3b48,"Failed to parse a value of type `{}[]`",&local_3b49);
        tinyusdz::value::TypeTraits<std::array<int,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_3b28,(string *)local_3b48,local_3b70);
        poVar2 = ::std::operator<<((ostream *)local_3b08,(string *)local_3b28);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_3b28);
        ::std::__cxx11::string::~string((string *)local_3b70);
        ::std::__cxx11::string::~string(local_3b48);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3b49);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_10._M_elems + 2));
        ::std::__cxx11::string::~string((string *)(val_10._M_elems + 2));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_3b08);
      }
      ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~vector
                ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)local_3990)
      ;
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(int4 *)local_3ba0);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_3d18);
      poVar2 = ::std::operator<<((ostream *)local_3d18,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3d58,"Failed to parse a value of type `{}`",&local_3d59);
      tinyusdz::value::TypeTraits<std::array<int,4ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_3d38,(string *)local_3d58,local_3d80);
      poVar2 = ::std::operator<<((ostream *)local_3d18,(string *)local_3d38);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_3d38);
      ::std::__cxx11::string::~string((string *)local_3d80);
      ::std::__cxx11::string::~string(local_3d58);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3d59);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_11.
                      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_11.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_3d18);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<int,4ul>>
              ((MetaVariable *)local_a0,(array<int,_4UL> *)local_3ba0);
    break;
  case 0x1b:
    if ((local_a1 & 1) != 0) {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d28);
      bVar1 = ParseBasicTypeArray<unsigned_int>
                        (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d28);
      if (bVar1) {
        MetaVariable::set_value<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((MetaVariable *)local_a0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d28);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_2ea0);
        poVar2 = ::std::operator<<((ostream *)local_2ea0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2ee0,"Failed to parse a value of type `{}[]`",&local_2ee1);
        tinyusdz::value::TypeTraits<unsigned_int>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_2ec0,(string *)local_2ee0,local_2f08);
        poVar2 = ::std::operator<<((ostream *)local_2ea0,(string *)local_2ec0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_2ec0);
        ::std::__cxx11::string::~string((string *)local_2f08);
        ::std::__cxx11::string::~string(local_2ee0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_2f28);
        ::std::__cxx11::string::~string((string *)local_2f28);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_2ea0);
      }
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d28);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_2f2c);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_30a8);
      poVar2 = ::std::operator<<((ostream *)local_30a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_30e8,"Failed to parse a value of type `{}`",&local_30e9);
      tinyusdz::value::TypeTraits<unsigned_int>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_30c8,(string *)local_30e8,local_3110);
      poVar2 = ::std::operator<<((ostream *)local_30a8,(string *)local_30c8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_30c8);
      ::std::__cxx11::string::~string((string *)local_3110);
      ::std::__cxx11::string::~string(local_30e8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_30e9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_8.
                      super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_8.
                  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_30a8);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<unsigned_int>((MetaVariable *)local_a0,&local_2f2c);
    break;
  case 0x1c:
    if ((local_a1 & 1) != 0) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e48);
      bVar1 = ParseBasicTypeArray<unsigned_long>
                        (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e48);
      if (bVar1) {
        MetaVariable::set_value<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  ((MetaVariable *)local_a0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e48);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4fc0);
        poVar2 = ::std::operator<<((ostream *)local_4fc0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_5000,"Failed to parse a value of type `{}[]`",&local_5001);
        tinyusdz::value::TypeTraits<unsigned_long>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_4fe0,(string *)local_5000,local_5028);
        poVar2 = ::std::operator<<((ostream *)local_4fc0,(string *)local_4fe0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_4fe0);
        ::std::__cxx11::string::~string((string *)local_5028);
        ::std::__cxx11::string::~string(local_5000);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5001);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_15);
        ::std::__cxx11::string::~string((string *)&val_15);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_4fc0);
      }
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e48);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_5050);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_51c8);
      poVar2 = ::std::operator<<((ostream *)local_51c8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5208,"Failed to parse a value of type `{}`",&local_5209);
      tinyusdz::value::TypeTraits<unsigned_long>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_51e8,(string *)local_5208,local_5230);
      poVar2 = ::std::operator<<((ostream *)local_51c8,(string *)local_51e8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_51e8);
      ::std::__cxx11::string::~string((string *)local_5230);
      ::std::__cxx11::string::~string(local_5208);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5209);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_16.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_16.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_51c8);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<unsigned_long>((MetaVariable *)local_a0,&local_5050);
    break;
  case 0x25:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ::vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                *)local_3db8);
      bVar1 = ParseBasicTypeArray<std::array<unsigned_int,2ul>>
                        (this,(vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                               *)local_3db8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    *)local_3db8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_3f30);
        poVar2 = ::std::operator<<((ostream *)local_3f30,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3f70,"Failed to parse a value of type `{}[]`",&local_3f71);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_3f50,(string *)local_3f70,local_3f98);
        poVar2 = ::std::operator<<((ostream *)local_3f30,(string *)local_3f50);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_3f50);
        ::std::__cxx11::string::~string((string *)local_3f98);
        ::std::__cxx11::string::~string(local_3f70);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3f71);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_11);
        ::std::__cxx11::string::~string((string *)&val_11);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_3f30);
      }
      ::std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ::~vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 *)local_3db8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_3fc0);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_4138);
      poVar2 = ::std::operator<<((ostream *)local_4138,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4178,"Failed to parse a value of type `{}`",&local_4179);
      tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_4158,(string *)local_4178,local_41a0);
      poVar2 = ::std::operator<<((ostream *)local_4138,(string *)local_4158);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_4158);
      ::std::__cxx11::string::~string((string *)local_41a0);
      ::std::__cxx11::string::~string(local_4178);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4179);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_12.
                      super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_12.
                  super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_4138);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<unsigned_int,2ul>>((MetaVariable *)local_a0,&local_3fc0);
    break;
  case 0x26:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
      ::vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                *)local_41d8);
      bVar1 = ParseBasicTypeArray<std::array<unsigned_int,3ul>>
                        (this,(vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                               *)local_41d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                    *)local_41d8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4350);
        poVar2 = ::std::operator<<((ostream *)local_4350,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_4390,"Failed to parse a value of type `{}[]`",&local_4391);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_4370,(string *)local_4390,local_43b8);
        poVar2 = ::std::operator<<((ostream *)local_4350,(string *)local_4370);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_4370);
        ::std::__cxx11::string::~string((string *)local_43b8);
        ::std::__cxx11::string::~string(local_4390);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_4391);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_12._M_elems + 1));
        ::std::__cxx11::string::~string((string *)(val_12._M_elems + 1));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_4350);
      }
      ::std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
      ::~vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                 *)local_41d8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(uint3 *)local_43e4);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_4560);
      poVar2 = ::std::operator<<((ostream *)local_4560,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_45a0,"Failed to parse a value of type `{}`",&local_45a1);
      tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_4580,(string *)local_45a0,local_45c8);
      poVar2 = ::std::operator<<((ostream *)local_4560,(string *)local_4580);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_4580);
      ::std::__cxx11::string::~string((string *)local_45c8);
      ::std::__cxx11::string::~string(local_45a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_45a1);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_13.
                      super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_13.
                  super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_4560);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<unsigned_int,3ul>>
              ((MetaVariable *)local_a0,(array<unsigned_int,_3UL> *)local_43e4);
    break;
  case 0x27:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
      ::vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                *)local_4600);
      bVar1 = ParseBasicTypeArray<std::array<unsigned_int,4ul>>
                        (this,(vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                               *)local_4600);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    *)local_4600);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4778);
        poVar2 = ::std::operator<<((ostream *)local_4778,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_47b8,"Failed to parse a value of type `{}[]`",&local_47b9);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_4798,(string *)local_47b8,local_47e0);
        poVar2 = ::std::operator<<((ostream *)local_4778,(string *)local_4798);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_4798);
        ::std::__cxx11::string::~string((string *)local_47e0);
        ::std::__cxx11::string::~string(local_47b8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_47b9);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_13._M_elems + 2));
        ::std::__cxx11::string::~string((string *)(val_13._M_elems + 2));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_4778);
      }
      ::std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
      ::~vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                 *)local_4600);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(uint4 *)local_4810);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_4988);
      poVar2 = ::std::operator<<((ostream *)local_4988,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_49c8,"Failed to parse a value of type `{}`",&local_49c9);
      tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_49a8,(string *)local_49c8,local_49f0);
      poVar2 = ::std::operator<<((ostream *)local_4988,(string *)local_49a8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_49a8);
      ::std::__cxx11::string::~string((string *)local_49f0);
      ::std::__cxx11::string::~string(local_49c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_49c9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_14.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_14.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_4988);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<unsigned_int,4ul>>
              ((MetaVariable *)local_a0,(array<unsigned_int,_4UL> *)local_4810);
    break;
  case 0x28:
    if ((local_a1 & 1) != 0) {
      ::std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_5268);
      bVar1 = ParseBasicTypeArray<float>(this,(vector<float,_std::allocator<float>_> *)local_5268);
      if (bVar1) {
        MetaVariable::set_value<std::vector<float,std::allocator<float>>>
                  ((MetaVariable *)local_a0,(vector<float,_std::allocator<float>_> *)local_5268);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_53e0);
        poVar2 = ::std::operator<<((ostream *)local_53e0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_5420,"Failed to parse a value of type `{}[]`",&local_5421);
        tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_5400,(string *)local_5420,local_5448);
        poVar2 = ::std::operator<<((ostream *)local_53e0,(string *)local_5400);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_5400);
        ::std::__cxx11::string::~string((string *)local_5448);
        ::std::__cxx11::string::~string(local_5420);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5421);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_5468);
        ::std::__cxx11::string::~string((string *)local_5468);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_53e0);
      }
      ::std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_5268);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_546c);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_55e8);
      poVar2 = ::std::operator<<((ostream *)local_55e8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5628,"Failed to parse a value of type `{}`",&local_5629);
      tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_5608,(string *)local_5628,local_5650);
      poVar2 = ::std::operator<<((ostream *)local_55e8,(string *)local_5608);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_5608);
      ::std::__cxx11::string::~string((string *)local_5650);
      ::std::__cxx11::string::~string(local_5628);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5629);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_17.
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_17.
                  super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_55e8);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<float>((MetaVariable *)local_a0,&local_546c);
    break;
  case 0x29:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
                ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                 local_5688);
      bVar1 = ParseBasicTypeArray<std::array<float,2ul>>
                        (this,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               *)local_5688);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   local_5688);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_5800);
        poVar2 = ::std::operator<<((ostream *)local_5800,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_5840,"Failed to parse a value of type `{}[]`",&local_5841);
        tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_5820,(string *)local_5840,local_5868);
        poVar2 = ::std::operator<<((ostream *)local_5800,(string *)local_5820);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_5820);
        ::std::__cxx11::string::~string((string *)local_5868);
        ::std::__cxx11::string::~string(local_5840);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5841);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_17);
        ::std::__cxx11::string::~string((string *)&val_17);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_5800);
      }
      ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
                ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                 local_5688);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_5890);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_5a08);
      poVar2 = ::std::operator<<((ostream *)local_5a08,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5a48,"Failed to parse a value of type `{}`",&local_5a49);
      tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_5a28,(string *)local_5a48,local_5a70);
      poVar2 = ::std::operator<<((ostream *)local_5a08,(string *)local_5a28);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_5a28);
      ::std::__cxx11::string::~string((string *)local_5a70);
      ::std::__cxx11::string::~string(local_5a48);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5a49);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_18.
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_18.
                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_5a08);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<float,2ul>>((MetaVariable *)local_a0,&local_5890);
    break;
  case 0x2a:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 local_5aa8);
      bVar1 = ParseBasicTypeArray<std::array<float,3ul>>
                        (this,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               *)local_5aa8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   local_5aa8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_5c20);
        poVar2 = ::std::operator<<((ostream *)local_5c20,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_5c60,"Failed to parse a value of type `{}[]`",&local_5c61);
        tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_5c40,(string *)local_5c60,local_5c88);
        poVar2 = ::std::operator<<((ostream *)local_5c20,(string *)local_5c40);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_5c40);
        ::std::__cxx11::string::~string((string *)local_5c88);
        ::std::__cxx11::string::~string(local_5c60);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5c61);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_18._M_elems + 1));
        ::std::__cxx11::string::~string((string *)(val_18._M_elems + 1));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_5c20);
      }
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 local_5aa8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(float3 *)local_5cb4);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_5e30);
      poVar2 = ::std::operator<<((ostream *)local_5e30,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5e70,"Failed to parse a value of type `{}`",&local_5e71);
      tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_5e50,(string *)local_5e70,local_5e98);
      poVar2 = ::std::operator<<((ostream *)local_5e30,(string *)local_5e50);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_5e50);
      ::std::__cxx11::string::~string((string *)local_5e98);
      ::std::__cxx11::string::~string(local_5e70);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5e71);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_19.
                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_19.
                  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_5e30);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<float,3ul>>
              ((MetaVariable *)local_a0,(array<float,_3UL> *)local_5cb4);
    break;
  case 0x2b:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
                ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                 local_5ed0);
      bVar1 = ParseBasicTypeArray<std::array<float,4ul>>
                        (this,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                               *)local_5ed0);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   local_5ed0);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_6048);
        poVar2 = ::std::operator<<((ostream *)local_6048,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_6088,"Failed to parse a value of type `{}[]`",&local_6089);
        tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_6068,(string *)local_6088,local_60b0);
        poVar2 = ::std::operator<<((ostream *)local_6048,(string *)local_6068);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_6068);
        ::std::__cxx11::string::~string((string *)local_60b0);
        ::std::__cxx11::string::~string(local_6088);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_6089);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_19._M_elems + 2));
        ::std::__cxx11::string::~string((string *)(val_19._M_elems + 2));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_6048);
      }
      ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::~vector
                ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                 local_5ed0);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(float4 *)local_60e0);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_6258);
      poVar2 = ::std::operator<<((ostream *)local_6258,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6298,"Failed to parse a value of type `{}`",&local_6299);
      tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_6278,(string *)local_6298,local_62c0);
      poVar2 = ::std::operator<<((ostream *)local_6258,(string *)local_6278);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_6278);
      ::std::__cxx11::string::~string((string *)local_62c0);
      ::std::__cxx11::string::~string(local_6298);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_6299);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_6258);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<float,4ul>>
              ((MetaVariable *)local_a0,(array<float,_4UL> *)local_60e0);
    break;
  case 0x2c:
    if ((local_a1 & 1) != 0) {
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_62f8);
      bVar1 = ParseBasicTypeArray<double>
                        (this,(vector<double,_std::allocator<double>_> *)local_62f8);
      if (bVar1) {
        MetaVariable::set_value<std::vector<double,std::allocator<double>>>
                  ((MetaVariable *)local_a0,(vector<double,_std::allocator<double>_> *)local_62f8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_6470);
        poVar2 = ::std::operator<<((ostream *)local_6470,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_64b0,"Failed to parse a value of type `{}[]`",&local_64b1);
        tinyusdz::value::TypeTraits<double>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_6490,(string *)local_64b0,local_64d8);
        poVar2 = ::std::operator<<((ostream *)local_6470,(string *)local_6490);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_6490);
        ::std::__cxx11::string::~string((string *)local_64d8);
        ::std::__cxx11::string::~string(local_64b0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_64b1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_20);
        ::std::__cxx11::string::~string((string *)&val_20);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_6470);
      }
      ::std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_62f8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_6500);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_6678);
      poVar2 = ::std::operator<<((ostream *)local_6678,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_66b8,"Failed to parse a value of type `{}`",&local_66b9);
      tinyusdz::value::TypeTraits<double>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_6698,(string *)local_66b8,local_66e0);
      poVar2 = ::std::operator<<((ostream *)local_6678,(string *)local_6698);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_6698);
      ::std::__cxx11::string::~string((string *)local_66e0);
      ::std::__cxx11::string::~string(local_66b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_66b9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_21.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_21.
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_6678);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<double>((MetaVariable *)local_a0,&local_6500);
    break;
  case 0x2d:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 local_6718);
      bVar1 = ParseBasicTypeArray<std::array<double,2ul>>
                        (this,(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                               *)local_6718);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   local_6718);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_6890);
        poVar2 = ::std::operator<<((ostream *)local_6890,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_68d0,"Failed to parse a value of type `{}[]`",&local_68d1);
        tinyusdz::value::TypeTraits<std::array<double,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_68b0,(string *)local_68d0,local_68f8);
        poVar2 = ::std::operator<<((ostream *)local_6890,(string *)local_68b0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_68b0);
        ::std::__cxx11::string::~string((string *)local_68f8);
        ::std::__cxx11::string::~string(local_68d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_68d1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_21._M_elems + 1));
        ::std::__cxx11::string::~string((string *)(val_21._M_elems + 1));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_6890);
      }
      ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
                ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 local_6718);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(double2 *)local_6928);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_6aa0);
      poVar2 = ::std::operator<<((ostream *)local_6aa0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6ae0,"Failed to parse a value of type `{}`",&local_6ae1);
      tinyusdz::value::TypeTraits<std::array<double,2ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_6ac0,(string *)local_6ae0,local_6b08);
      poVar2 = ::std::operator<<((ostream *)local_6aa0,(string *)local_6ac0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_6ac0);
      ::std::__cxx11::string::~string((string *)local_6b08);
      ::std::__cxx11::string::~string(local_6ae0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_6ae1);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_22.
                      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_22.
                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_6aa0);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<double,2ul>>
              ((MetaVariable *)local_a0,(array<double,_2UL> *)local_6928);
    break;
  case 0x2e:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 local_6b40);
      bVar1 = ParseBasicTypeArray<std::array<double,3ul>>
                        (this,(vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                               *)local_6b40);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   local_6b40);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_6cb8);
        poVar2 = ::std::operator<<((ostream *)local_6cb8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_6cf8,"Failed to parse a value of type `{}[]`",&local_6cf9);
        tinyusdz::value::TypeTraits<std::array<double,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_6cd8,(string *)local_6cf8,local_6d20);
        poVar2 = ::std::operator<<((ostream *)local_6cb8,(string *)local_6cd8);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_6cd8);
        ::std::__cxx11::string::~string((string *)local_6d20);
        ::std::__cxx11::string::~string(local_6cf8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_6cf9);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_22._M_elems + 2));
        ::std::__cxx11::string::~string((string *)(val_22._M_elems + 2));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_6cb8);
      }
      ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
                ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 local_6b40);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(double3 *)local_6d58);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_6ed0);
      poVar2 = ::std::operator<<((ostream *)local_6ed0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6f10,"Failed to parse a value of type `{}`",&local_6f11);
      tinyusdz::value::TypeTraits<std::array<double,3ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_6ef0,(string *)local_6f10,local_6f38);
      poVar2 = ::std::operator<<((ostream *)local_6ed0,(string *)local_6ef0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_6ef0);
      ::std::__cxx11::string::~string((string *)local_6f38);
      ::std::__cxx11::string::~string(local_6f10);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_6f11);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_23.
                      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_23.
                  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_6ed0);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<double,3ul>>
              ((MetaVariable *)local_a0,(array<double,_3UL> *)local_6d58);
    break;
  case 0x2f:
    if ((local_a1 & 1) != 0) {
      ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::vector
                ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                 local_6f70);
      bVar1 = ParseBasicTypeArray<std::array<double,4ul>>
                        (this,(vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                               *)local_6f70);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                  ((MetaVariable *)local_a0,
                   (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   local_6f70);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_70e8);
        poVar2 = ::std::operator<<((ostream *)local_70e8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_7128,"Failed to parse a value of type `{}[]`",&local_7129);
        tinyusdz::value::TypeTraits<std::array<double,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_7108,(string *)local_7128,local_7150);
        poVar2 = ::std::operator<<((ostream *)local_70e8,(string *)local_7108);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_7108);
        ::std::__cxx11::string::~string((string *)local_7150);
        ::std::__cxx11::string::~string(local_7128);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7129);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_23._M_elems + 3));
        ::std::__cxx11::string::~string((string *)(val_23._M_elems + 3));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_70e8);
      }
      ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::~vector
                ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                 local_6f70);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(double4 *)local_7190);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_7308);
      poVar2 = ::std::operator<<((ostream *)local_7308,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7348,"Failed to parse a value of type `{}`",&local_7349);
      tinyusdz::value::TypeTraits<std::array<double,4ul>>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_7328,(string *)local_7348,local_7370);
      poVar2 = ::std::operator<<((ostream *)local_7308,(string *)local_7328);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_7328);
      ::std::__cxx11::string::~string((string *)local_7370);
      ::std::__cxx11::string::~string(local_7348);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7349);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_24.
                      super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_24.
                  super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_7308);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<std::array<double,4ul>>
              ((MetaVariable *)local_a0,(array<double,_4UL> *)local_7190);
    break;
  case 0x30:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::vector
                ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                 local_8d98);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::quath>
                        (this,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                               *)local_8d98);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   local_8d98);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_8f10);
        poVar2 = ::std::operator<<((ostream *)local_8f10,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_8f50,"Failed to parse a value of type `{}[]`",&local_8f51);
        tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_8f30,(string *)local_8f50,local_8f78);
        poVar2 = ::std::operator<<((ostream *)local_8f10,(string *)local_8f30);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_8f30);
        ::std::__cxx11::string::~string((string *)local_8f78);
        ::std::__cxx11::string::~string(local_8f50);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8f51);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_30);
        ::std::__cxx11::string::~string((string *)&val_30);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_8f10);
      }
      ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::~vector
                ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                 local_8d98);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_8fa0);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_9118);
      poVar2 = ::std::operator<<((ostream *)local_9118,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9158,"Failed to parse a value of type `{}`",&local_9159);
      tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_9138,(string *)local_9158,local_9180);
      poVar2 = ::std::operator<<((ostream *)local_9118,(string *)local_9138);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_9138);
      ::std::__cxx11::string::~string((string *)local_9180);
      ::std::__cxx11::string::~string(local_9158);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_9159);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_31.
                      super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_31.
                  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_9118);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::quath>((MetaVariable *)local_a0,&local_8fa0);
    break;
  case 0x31:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::vector
                ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                 local_91b8);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::quatf>
                        (this,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                               *)local_91b8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   local_91b8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_9330);
        poVar2 = ::std::operator<<((ostream *)local_9330,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_9370,"Failed to parse a value of type `{}[]`",&local_9371);
        tinyusdz::value::TypeTraits<tinyusdz::value::quatf>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_9350,(string *)local_9370,local_9398);
        poVar2 = ::std::operator<<((ostream *)local_9330,(string *)local_9350);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_9350);
        ::std::__cxx11::string::~string((string *)local_9398);
        ::std::__cxx11::string::~string(local_9370);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_9371);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_31.imag._M_elems + 2));
        ::std::__cxx11::string::~string((string *)(val_31.imag._M_elems + 2));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_9330);
      }
      ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::~vector
                ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                 local_91b8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(quatf *)local_93c8);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_9540);
      poVar2 = ::std::operator<<((ostream *)local_9540,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9580,"Failed to parse a value of type `{}`",&local_9581);
      tinyusdz::value::TypeTraits<tinyusdz::value::quatf>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_9560,(string *)local_9580,local_95a8);
      poVar2 = ::std::operator<<((ostream *)local_9540,(string *)local_9560);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_9560);
      ::std::__cxx11::string::~string((string *)local_95a8);
      ::std::__cxx11::string::~string(local_9580);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_9581);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_32.
                      super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_32.
                  super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_9540);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::quatf>((MetaVariable *)local_a0,(quatf *)local_93c8);
    break;
  case 0x32:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::vector
                ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                 local_95e0);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::quatd>
                        (this,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                               *)local_95e0);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   local_95e0);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_9758);
        poVar2 = ::std::operator<<((ostream *)local_9758,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_9798,"Failed to parse a value of type `{}[]`",&local_9799);
        tinyusdz::value::TypeTraits<tinyusdz::value::quatd>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_9778,(string *)local_9798,local_97c0);
        poVar2 = ::std::operator<<((ostream *)local_9758,(string *)local_9778);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_9778);
        ::std::__cxx11::string::~string((string *)local_97c0);
        ::std::__cxx11::string::~string(local_9798);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_9799);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_32.real);
        ::std::__cxx11::string::~string((string *)&val_32.real);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_9758);
      }
      ::std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::~vector
                ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                 local_95e0);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(quatd *)local_9800);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_9978);
      poVar2 = ::std::operator<<((ostream *)local_9978,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_99b8,"Failed to parse a value of type `{}`",&local_99b9);
      tinyusdz::value::TypeTraits<tinyusdz::value::quatd>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_9998,(string *)local_99b8,local_99e0);
      poVar2 = ::std::operator<<((ostream *)local_9978,(string *)local_9998);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_9998);
      ::std::__cxx11::string::~string((string *)local_99e0);
      ::std::__cxx11::string::~string(local_99b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_99b9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_33.
                      super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_33.
                  super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_9978);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::quatd>((MetaVariable *)local_a0,(quatd *)local_9800);
    break;
  case 0x33:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::vector
                ((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                 local_73a8);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix2f>
                        (this,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                               *)local_73a8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                   local_73a8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_7520);
        poVar2 = ::std::operator<<((ostream *)local_7520,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_7560,"Failed to parse a value of type `{}[]`",&local_7561);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix2f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_7540,(string *)local_7560,local_7588);
        poVar2 = ::std::operator<<((ostream *)local_7520,(string *)local_7540);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_7540);
        ::std::__cxx11::string::~string((string *)local_7588);
        ::std::__cxx11::string::~string(local_7560);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7561);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_24.m + 1));
        ::std::__cxx11::string::~string((string *)(val_24.m + 1));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_7520);
      }
      ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::~vector
                ((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                 local_73a8);
      goto joined_r0x004f0ae4;
    }
    tinyusdz::value::matrix2f::matrix2f((matrix2f *)local_75b8);
    bVar1 = ReadBasicType(this,(matrix2f *)local_75b8);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_7730);
      poVar2 = ::std::operator<<((ostream *)local_7730,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7770,"Failed to parse a value of type `{}`",&local_7771);
      tinyusdz::value::TypeTraits<tinyusdz::value::matrix2f>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_7750,(string *)local_7770,local_7798);
      poVar2 = ::std::operator<<((ostream *)local_7730,(string *)local_7750);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_7750);
      ::std::__cxx11::string::~string((string *)local_7798);
      ::std::__cxx11::string::~string(local_7770);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7771);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_25.
                      super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_25.
                  super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_7730);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::matrix2f>
              ((MetaVariable *)local_a0,(matrix2f *)local_75b8);
    break;
  case 0x34:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::vector
                ((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                 local_77d0);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix3f>
                        (this,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                               *)local_77d0);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                   local_77d0);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_7948);
        poVar2 = ::std::operator<<((ostream *)local_7948,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_7988,"Failed to parse a value of type `{}[]`",&local_7989);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_7968,(string *)local_7988,local_79b0);
        poVar2 = ::std::operator<<((ostream *)local_7948,(string *)local_7968);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_7968);
        ::std::__cxx11::string::~string((string *)local_79b0);
        ::std::__cxx11::string::~string(local_7988);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7989);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_25.m[2] + 1));
        ::std::__cxx11::string::~string((string *)(val_25.m[2] + 1));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_7948);
      }
      ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::~vector
                ((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                 local_77d0);
      goto joined_r0x004f0ae4;
    }
    tinyusdz::value::matrix3f::matrix3f((matrix3f *)local_79f4);
    bVar1 = ReadBasicType(this,(matrix3f *)local_79f4);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_7b70);
      poVar2 = ::std::operator<<((ostream *)local_7b70,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7bb0,"Failed to parse a value of type `{}`",&local_7bb1);
      tinyusdz::value::TypeTraits<tinyusdz::value::matrix3f>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_7b90,(string *)local_7bb0,local_7bd8);
      poVar2 = ::std::operator<<((ostream *)local_7b70,(string *)local_7b90);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_7b90);
      ::std::__cxx11::string::~string((string *)local_7bd8);
      ::std::__cxx11::string::~string(local_7bb0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7bb1);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_26.
                      super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_26.
                  super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_7b70);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::matrix3f>
              ((MetaVariable *)local_a0,(matrix3f *)local_79f4);
    break;
  case 0x35:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::vector
                ((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                 local_7c10);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix4f>
                        (this,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                               *)local_7c10);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                   local_7c10);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_7d88);
        poVar2 = ::std::operator<<((ostream *)local_7d88,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_7dc8,"Failed to parse a value of type `{}[]`",&local_7dc9);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix4f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_7da8,(string *)local_7dc8,local_7df0);
        poVar2 = ::std::operator<<((ostream *)local_7d88,(string *)local_7da8);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_7da8);
        ::std::__cxx11::string::~string((string *)local_7df0);
        ::std::__cxx11::string::~string(local_7dc8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7dc9);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_26.m[3] + 2));
        ::std::__cxx11::string::~string((string *)(val_26.m[3] + 2));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_7d88);
      }
      ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::~vector
                ((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                 local_7c10);
      goto joined_r0x004f0ae4;
    }
    tinyusdz::value::matrix4f::matrix4f((matrix4f *)local_7e50);
    bVar1 = ReadBasicType(this,(matrix4f *)local_7e50);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_7fc8);
      poVar2 = ::std::operator<<((ostream *)local_7fc8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8008,"Failed to parse a value of type `{}`",&local_8009);
      tinyusdz::value::TypeTraits<tinyusdz::value::matrix4f>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_7fe8,(string *)local_8008,local_8030);
      poVar2 = ::std::operator<<((ostream *)local_7fc8,(string *)local_7fe8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_7fe8);
      ::std::__cxx11::string::~string((string *)local_8030);
      ::std::__cxx11::string::~string(local_8008);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_8009);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_27.
                      super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_27.
                  super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_7fc8);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::matrix4f>
              ((MetaVariable *)local_a0,(matrix4f *)local_7e50);
    break;
  case 0x36:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::vector
                ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 local_8068);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix2d>
                        (this,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                               *)local_8068);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                   local_8068);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_81e0);
        poVar2 = ::std::operator<<((ostream *)local_81e0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_8220,"Failed to parse a value of type `{}[]`",&local_8221);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix2d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_8200,(string *)local_8220,local_8248);
        poVar2 = ::std::operator<<((ostream *)local_81e0,(string *)local_8200);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_8200);
        ::std::__cxx11::string::~string((string *)local_8248);
        ::std::__cxx11::string::~string(local_8220);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8221);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_27.m[1] + 1));
        ::std::__cxx11::string::~string((string *)(val_27.m[1] + 1));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_81e0);
      }
      ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::~vector
                ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 local_8068);
      goto joined_r0x004f0ae4;
    }
    tinyusdz::value::matrix2d::matrix2d((matrix2d *)local_8288);
    bVar1 = ReadBasicType(this,(matrix2d *)local_8288);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_8400);
      poVar2 = ::std::operator<<((ostream *)local_8400,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8440,"Failed to parse a value of type `{}`",&local_8441);
      tinyusdz::value::TypeTraits<tinyusdz::value::matrix2d>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_8420,(string *)local_8440,local_8468);
      poVar2 = ::std::operator<<((ostream *)local_8400,(string *)local_8420);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_8420);
      ::std::__cxx11::string::~string((string *)local_8468);
      ::std::__cxx11::string::~string(local_8440);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_8441);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_28.
                      super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_28.
                  super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_8400);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::matrix2d>
              ((MetaVariable *)local_a0,(matrix2d *)local_8288);
    break;
  case 0x37:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::vector
                ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 local_84a0);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix3d>
                        (this,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                               *)local_84a0);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                   local_84a0);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_8618);
        poVar2 = ::std::operator<<((ostream *)local_8618,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_8658,"Failed to parse a value of type `{}[]`",&local_8659);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_8638,(string *)local_8658,local_8680);
        poVar2 = ::std::operator<<((ostream *)local_8618,(string *)local_8638);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_8638);
        ::std::__cxx11::string::~string((string *)local_8680);
        ::std::__cxx11::string::~string(local_8658);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8659);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_28.m[2] + 2));
        ::std::__cxx11::string::~string((string *)(val_28.m[2] + 2));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_8618);
      }
      ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::~vector
                ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 local_84a0);
      goto joined_r0x004f0ae4;
    }
    tinyusdz::value::matrix3d::matrix3d((matrix3d *)local_86e8);
    bVar1 = ReadBasicType(this,(matrix3d *)local_86e8);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_8860);
      poVar2 = ::std::operator<<((ostream *)local_8860,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_88a0,"Failed to parse a value of type `{}`",&local_88a1);
      tinyusdz::value::TypeTraits<tinyusdz::value::matrix3d>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_8880,(string *)local_88a0,local_88c8);
      poVar2 = ::std::operator<<((ostream *)local_8860,(string *)local_8880);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_8880);
      ::std::__cxx11::string::~string((string *)local_88c8);
      ::std::__cxx11::string::~string(local_88a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_88a1);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_29.
                      super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_29.
                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_8860);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::matrix3d>
              ((MetaVariable *)local_a0,(matrix3d *)local_86e8);
    break;
  case 0x38:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 local_8900);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix4d>
                        (this,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                               *)local_8900);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   local_8900);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_8a78);
        poVar2 = ::std::operator<<((ostream *)local_8a78,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_8ab8,"Failed to parse a value of type `{}[]`",&local_8ab9);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_8a98,(string *)local_8ab8,local_8ae0);
        poVar2 = ::std::operator<<((ostream *)local_8a78,(string *)local_8a98);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_8a98);
        ::std::__cxx11::string::~string((string *)local_8ae0);
        ::std::__cxx11::string::~string(local_8ab8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8ab9);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)(val_29.m[3] + 3));
        ::std::__cxx11::string::~string((string *)(val_29.m[3] + 3));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_8a78);
      }
      ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::~vector
                ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 local_8900);
      goto joined_r0x004f0ae4;
    }
    tinyusdz::value::matrix4d::matrix4d((matrix4d *)local_8b80);
    bVar1 = ReadBasicType(this,(matrix4d *)local_8b80);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_8cf8);
      poVar2 = ::std::operator<<((ostream *)local_8cf8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8d38,"Failed to parse a value of type `{}`",&local_8d39);
      tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_8d18,(string *)local_8d38,local_8d60);
      poVar2 = ::std::operator<<((ostream *)local_8cf8,(string *)local_8d18);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_8d18);
      ::std::__cxx11::string::~string((string *)local_8d60);
      ::std::__cxx11::string::~string(local_8d38);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_8d39);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_30.
                      super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_30.
                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_8cf8);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::matrix4d>
              ((MetaVariable *)local_a0,(matrix4d *)local_8b80);
    break;
  case 0x3a:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::vector
                ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 local_bf80);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::color3f>
                        (this,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                               *)local_bf80);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   local_bf80);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_c0f8);
        poVar2 = ::std::operator<<((ostream *)local_c0f8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_c138,"Failed to parse a value of type `{}[]`",&local_c139);
        tinyusdz::value::TypeTraits<tinyusdz::value::color3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_c118,(string *)local_c138,local_c160);
        poVar2 = ::std::operator<<((ostream *)local_c0f8,(string *)local_c118);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_c118);
        ::std::__cxx11::string::~string((string *)local_c160);
        ::std::__cxx11::string::~string(local_c138);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c139);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_42.g);
        ::std::__cxx11::string::~string((string *)&val_42.g);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_c0f8);
      }
      ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::~vector
                ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 local_bf80);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(color3f *)local_c18c);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_c308);
      poVar2 = ::std::operator<<((ostream *)local_c308,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c348,"Failed to parse a value of type `{}`",&local_c349);
      tinyusdz::value::TypeTraits<tinyusdz::value::color3f>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_c328,(string *)local_c348,local_c370);
      poVar2 = ::std::operator<<((ostream *)local_c308,(string *)local_c328);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_c328);
      ::std::__cxx11::string::~string((string *)local_c370);
      ::std::__cxx11::string::~string(local_c348);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c349);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_43.
                      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_43.
                  super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_c308);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::color3f>
              ((MetaVariable *)local_a0,(color3f *)local_c18c);
    break;
  case 0x3b:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::vector
                ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                 local_c3a8);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::color3d>
                        (this,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                               *)local_c3a8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   local_c3a8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_c520);
        poVar2 = ::std::operator<<((ostream *)local_c520,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_c560,"Failed to parse a value of type `{}[]`",&local_c561);
        tinyusdz::value::TypeTraits<tinyusdz::value::color3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_c540,(string *)local_c560,local_c588);
        poVar2 = ::std::operator<<((ostream *)local_c520,(string *)local_c540);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_c540);
        ::std::__cxx11::string::~string((string *)local_c588);
        ::std::__cxx11::string::~string(local_c560);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c561);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_43.b);
        ::std::__cxx11::string::~string((string *)&val_43.b);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_c520);
      }
      ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::~vector
                ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                 local_c3a8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(color3d *)local_c5c0);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_c738);
      poVar2 = ::std::operator<<((ostream *)local_c738,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c778,"Failed to parse a value of type `{}`",&local_c779);
      tinyusdz::value::TypeTraits<tinyusdz::value::color3d>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_c758,(string *)local_c778,local_c7a0);
      poVar2 = ::std::operator<<((ostream *)local_c738,(string *)local_c758);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_c758);
      ::std::__cxx11::string::~string((string *)local_c7a0);
      ::std::__cxx11::string::~string(local_c778);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c779);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_44.
                      super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_44.
                  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_c738);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::color3d>
              ((MetaVariable *)local_a0,(color3d *)local_c5c0);
    break;
  case 0x3d:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::vector
                ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                 local_c7d8);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::color4f>
                        (this,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                               *)local_c7d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   local_c7d8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_c950);
        poVar2 = ::std::operator<<((ostream *)local_c950,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_c990,"Failed to parse a value of type `{}[]`",&local_c991);
        tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_c970,(string *)local_c990,local_c9b8);
        poVar2 = ::std::operator<<((ostream *)local_c950,(string *)local_c970);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_c970);
        ::std::__cxx11::string::~string((string *)local_c9b8);
        ::std::__cxx11::string::~string(local_c990);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c991);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_44.b);
        ::std::__cxx11::string::~string((string *)&val_44.b);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_c950);
      }
      ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::~vector
                ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                 local_c7d8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(color4f *)local_c9e8);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_cb60);
      poVar2 = ::std::operator<<((ostream *)local_cb60,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cba0,"Failed to parse a value of type `{}`",&local_cba1);
      tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_cb80,(string *)local_cba0,local_cbc8);
      poVar2 = ::std::operator<<((ostream *)local_cb60,(string *)local_cb80);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_cb80);
      ::std::__cxx11::string::~string((string *)local_cbc8);
      ::std::__cxx11::string::~string(local_cba0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_cba1);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_45.
                      super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_45.
                  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_cb60);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::color4f>
              ((MetaVariable *)local_a0,(color4f *)local_c9e8);
    break;
  case 0x3e:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::vector
                ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                 local_cc00);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::color4d>
                        (this,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                               *)local_cc00);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   local_cc00);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_cd78);
        poVar2 = ::std::operator<<((ostream *)local_cd78,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_cdb8,"Failed to parse a value of type `{}[]`",&local_cdb9);
        tinyusdz::value::TypeTraits<tinyusdz::value::color4d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_cd98,(string *)local_cdb8,local_cde0);
        poVar2 = ::std::operator<<((ostream *)local_cd78,(string *)local_cd98);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_cd98);
        ::std::__cxx11::string::~string((string *)local_cde0);
        ::std::__cxx11::string::~string(local_cdb8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_cdb9);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_45.a);
        ::std::__cxx11::string::~string((string *)&val_45.a);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_cd78);
      }
      ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::~vector
                ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                 local_cc00);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(color4d *)local_ce20);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_cf98);
      poVar2 = ::std::operator<<((ostream *)local_cf98,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cfd8,"Failed to parse a value of type `{}`",&local_cfd9);
      tinyusdz::value::TypeTraits<tinyusdz::value::color4d>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_cfb8,(string *)local_cfd8,local_d000);
      poVar2 = ::std::operator<<((ostream *)local_cf98,(string *)local_cfb8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_cfb8);
      ::std::__cxx11::string::~string((string *)local_d000);
      ::std::__cxx11::string::~string(local_cfd8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_cfd9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_46.
                      super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_46.
                  super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_cf98);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::color4d>
              ((MetaVariable *)local_a0,(color4d *)local_ce20);
    break;
  case 0x3f:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::vector
                ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                 local_b308);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::point3h>
                        (this,(vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                               *)local_b308);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   local_b308);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_b480);
        poVar2 = ::std::operator<<((ostream *)local_b480,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_b4c0,"Failed to parse a value of type `{}[]`",&local_b4c1);
        tinyusdz::value::TypeTraits<tinyusdz::value::point3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_b4a0,(string *)local_b4c0,local_b4e8);
        poVar2 = ::std::operator<<((ostream *)local_b480,(string *)local_b4a0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_b4a0);
        ::std::__cxx11::string::~string((string *)local_b4e8);
        ::std::__cxx11::string::~string(local_b4c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b4c1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_b508);
        ::std::__cxx11::string::~string((string *)local_b508);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_b480);
      }
      ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::~vector
                ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                 local_b308);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_b50e);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_b688);
      poVar2 = ::std::operator<<((ostream *)local_b688,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b6c8,"Failed to parse a value of type `{}`",&local_b6c9);
      tinyusdz::value::TypeTraits<tinyusdz::value::point3h>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_b6a8,(string *)local_b6c8,local_b6f0);
      poVar2 = ::std::operator<<((ostream *)local_b688,(string *)local_b6a8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_b6a8);
      ::std::__cxx11::string::~string((string *)local_b6f0);
      ::std::__cxx11::string::~string(local_b6c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b6c9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_40.
                      super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_40.
                  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_b688);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::point3h>((MetaVariable *)local_a0,&local_b50e);
    break;
  case 0x40:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
                ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 local_b728);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::point3f>
                        (this,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                               *)local_b728);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   local_b728);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_b8a0);
        poVar2 = ::std::operator<<((ostream *)local_b8a0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_b8e0,"Failed to parse a value of type `{}[]`",&local_b8e1);
        tinyusdz::value::TypeTraits<tinyusdz::value::point3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_b8c0,(string *)local_b8e0,local_b908);
        poVar2 = ::std::operator<<((ostream *)local_b8a0,(string *)local_b8c0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_b8c0);
        ::std::__cxx11::string::~string((string *)local_b908);
        ::std::__cxx11::string::~string(local_b8e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b8e1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_40.y);
        ::std::__cxx11::string::~string((string *)&val_40.y);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_b8a0);
      }
      ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::~vector
                ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 local_b728);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(point3f *)local_b934);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_bab0);
      poVar2 = ::std::operator<<((ostream *)local_bab0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_baf0,"Failed to parse a value of type `{}`",&local_baf1);
      tinyusdz::value::TypeTraits<tinyusdz::value::point3f>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_bad0,(string *)local_baf0,local_bb18);
      poVar2 = ::std::operator<<((ostream *)local_bab0,(string *)local_bad0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_bad0);
      ::std::__cxx11::string::~string((string *)local_bb18);
      ::std::__cxx11::string::~string(local_baf0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_baf1);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_41.
                      super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_41.
                  super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_bab0);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::point3f>
              ((MetaVariable *)local_a0,(point3f *)local_b934);
    break;
  case 0x41:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::vector
                ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                 local_bb50);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::point3d>
                        (this,(vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                               *)local_bb50);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   local_bb50);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_bcc8);
        poVar2 = ::std::operator<<((ostream *)local_bcc8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_bd08,"Failed to parse a value of type `{}[]`",&local_bd09);
        tinyusdz::value::TypeTraits<tinyusdz::value::point3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_bce8,(string *)local_bd08,local_bd30);
        poVar2 = ::std::operator<<((ostream *)local_bcc8,(string *)local_bce8);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_bce8);
        ::std::__cxx11::string::~string((string *)local_bd30);
        ::std::__cxx11::string::~string(local_bd08);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_bd09);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_41.z);
        ::std::__cxx11::string::~string((string *)&val_41.z);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_bcc8);
      }
      ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::~vector
                ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                 local_bb50);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(point3d *)local_bd68);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_bee0);
      poVar2 = ::std::operator<<((ostream *)local_bee0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_bf20,"Failed to parse a value of type `{}`",&local_bf21);
      tinyusdz::value::TypeTraits<tinyusdz::value::point3d>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_bf00,(string *)local_bf20,local_bf48);
      poVar2 = ::std::operator<<((ostream *)local_bee0,(string *)local_bf00);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_bf00);
      ::std::__cxx11::string::~string((string *)local_bf48);
      ::std::__cxx11::string::~string(local_bf20);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_bf21);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_42.
                      super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_42.
                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_bee0);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::point3d>
              ((MetaVariable *)local_a0,(point3d *)local_bd68);
    break;
  case 0x42:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::vector
                ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                 local_9a18);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3h>
                        (this,(vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                               *)local_9a18);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   local_9a18);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_9b90);
        poVar2 = ::std::operator<<((ostream *)local_9b90,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_9bd0,"Failed to parse a value of type `{}[]`",&local_9bd1);
        tinyusdz::value::TypeTraits<tinyusdz::value::normal3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_9bb0,(string *)local_9bd0,local_9bf8);
        poVar2 = ::std::operator<<((ostream *)local_9b90,(string *)local_9bb0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_9bb0);
        ::std::__cxx11::string::~string((string *)local_9bf8);
        ::std::__cxx11::string::~string(local_9bd0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_9bd1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_9c18);
        ::std::__cxx11::string::~string((string *)local_9c18);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_9b90);
      }
      ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::~vector
                ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                 local_9a18);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_9c1e);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_9d98);
      poVar2 = ::std::operator<<((ostream *)local_9d98,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9dd8,"Failed to parse a value of type `{}`",&local_9dd9);
      tinyusdz::value::TypeTraits<tinyusdz::value::normal3h>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_9db8,(string *)local_9dd8,local_9e00);
      poVar2 = ::std::operator<<((ostream *)local_9d98,(string *)local_9db8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_9db8);
      ::std::__cxx11::string::~string((string *)local_9e00);
      ::std::__cxx11::string::~string(local_9dd8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_9dd9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_34.
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_34.
                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_9d98);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::normal3h>((MetaVariable *)local_a0,&local_9c1e);
    break;
  case 0x43:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::vector
                ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 local_9e38);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3f>
                        (this,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                               *)local_9e38);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   local_9e38);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_9fb0);
        poVar2 = ::std::operator<<((ostream *)local_9fb0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_9ff0,"Failed to parse a value of type `{}[]`",&local_9ff1);
        tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_9fd0,(string *)local_9ff0,local_a018);
        poVar2 = ::std::operator<<((ostream *)local_9fb0,(string *)local_9fd0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_9fd0);
        ::std::__cxx11::string::~string((string *)local_a018);
        ::std::__cxx11::string::~string(local_9ff0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_9ff1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_34.y);
        ::std::__cxx11::string::~string((string *)&val_34.y);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_9fb0);
      }
      ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::~vector
                ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 local_9e38);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(normal3f *)local_a044);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_a1c0);
      poVar2 = ::std::operator<<((ostream *)local_a1c0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a200,"Failed to parse a value of type `{}`",&local_a201);
      tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_a1e0,(string *)local_a200,local_a228);
      poVar2 = ::std::operator<<((ostream *)local_a1c0,(string *)local_a1e0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_a1e0);
      ::std::__cxx11::string::~string((string *)local_a228);
      ::std::__cxx11::string::~string(local_a200);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a201);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_35.
                      super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_35.
                  super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_a1c0);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::normal3f>
              ((MetaVariable *)local_a0,(normal3f *)local_a044);
    break;
  case 0x44:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::vector
                ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                 local_a260);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3d>
                        (this,(vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                               *)local_a260);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   local_a260);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_a3d8);
        poVar2 = ::std::operator<<((ostream *)local_a3d8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a418,"Failed to parse a value of type `{}[]`",&local_a419);
        tinyusdz::value::TypeTraits<tinyusdz::value::normal3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_a3f8,(string *)local_a418,local_a440);
        poVar2 = ::std::operator<<((ostream *)local_a3d8,(string *)local_a3f8);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_a3f8);
        ::std::__cxx11::string::~string((string *)local_a440);
        ::std::__cxx11::string::~string(local_a418);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a419);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_35.z);
        ::std::__cxx11::string::~string((string *)&val_35.z);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_a3d8);
      }
      ::std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::~vector
                ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                 local_a260);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(normal3d *)local_a478);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_a5f0);
      poVar2 = ::std::operator<<((ostream *)local_a5f0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a630,"Failed to parse a value of type `{}`",&local_a631);
      tinyusdz::value::TypeTraits<tinyusdz::value::normal3d>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_a610,(string *)local_a630,local_a658);
      poVar2 = ::std::operator<<((ostream *)local_a5f0,(string *)local_a610);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_a610);
      ::std::__cxx11::string::~string((string *)local_a658);
      ::std::__cxx11::string::~string(local_a630);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a631);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_36.
                      super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_36.
                  super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_a5f0);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::normal3d>
              ((MetaVariable *)local_a0,(normal3d *)local_a478);
    break;
  case 0x45:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::vector
                ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                 local_a690);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3h>
                        (this,(vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                               *)local_a690);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   local_a690);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_a808);
        poVar2 = ::std::operator<<((ostream *)local_a808,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a848,"Failed to parse a value of type `{}[]`",&local_a849);
        tinyusdz::value::TypeTraits<tinyusdz::value::vector3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_a828,(string *)local_a848,local_a870);
        poVar2 = ::std::operator<<((ostream *)local_a808,(string *)local_a828);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_a828);
        ::std::__cxx11::string::~string((string *)local_a870);
        ::std::__cxx11::string::~string(local_a848);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a849);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_a890);
        ::std::__cxx11::string::~string((string *)local_a890);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_a808);
      }
      ::std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::~vector
                ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                 local_a690);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_a896);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_aa10);
      poVar2 = ::std::operator<<((ostream *)local_aa10,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_aa50,"Failed to parse a value of type `{}`",&local_aa51);
      tinyusdz::value::TypeTraits<tinyusdz::value::vector3h>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_aa30,(string *)local_aa50,local_aa78);
      poVar2 = ::std::operator<<((ostream *)local_aa10,(string *)local_aa30);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_aa30);
      ::std::__cxx11::string::~string((string *)local_aa78);
      ::std::__cxx11::string::~string(local_aa50);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_aa51);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_37.
                      super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_37.
                  super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_aa10);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::vector3h>((MetaVariable *)local_a0,&local_a896);
    break;
  case 0x46:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::vector
                ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                 local_aab0);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3f>
                        (this,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                               *)local_aab0);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   local_aab0);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_ac28);
        poVar2 = ::std::operator<<((ostream *)local_ac28,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_ac68,"Failed to parse a value of type `{}[]`",&local_ac69);
        tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_ac48,(string *)local_ac68,local_ac90);
        poVar2 = ::std::operator<<((ostream *)local_ac28,(string *)local_ac48);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_ac48);
        ::std::__cxx11::string::~string((string *)local_ac90);
        ::std::__cxx11::string::~string(local_ac68);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ac69);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_37.y);
        ::std::__cxx11::string::~string((string *)&val_37.y);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_ac28);
      }
      ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::~vector
                ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                 local_aab0);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(vector3f *)local_acbc);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_ae38);
      poVar2 = ::std::operator<<((ostream *)local_ae38,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ae78,"Failed to parse a value of type `{}`",&local_ae79);
      tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_ae58,(string *)local_ae78,local_aea0);
      poVar2 = ::std::operator<<((ostream *)local_ae38,(string *)local_ae58);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_ae58);
      ::std::__cxx11::string::~string((string *)local_aea0);
      ::std::__cxx11::string::~string(local_ae78);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ae79);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_38.
                      super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_38.
                  super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_ae38);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::vector3f>
              ((MetaVariable *)local_a0,(vector3f *)local_acbc);
    break;
  case 0x47:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::vector
                ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                 local_aed8);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3d>
                        (this,(vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                               *)local_aed8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   local_aed8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_b050);
        poVar2 = ::std::operator<<((ostream *)local_b050,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_b090,"Failed to parse a value of type `{}[]`",&local_b091);
        tinyusdz::value::TypeTraits<tinyusdz::value::vector3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_b070,(string *)local_b090,local_b0b8);
        poVar2 = ::std::operator<<((ostream *)local_b050,(string *)local_b070);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_b070);
        ::std::__cxx11::string::~string((string *)local_b0b8);
        ::std::__cxx11::string::~string(local_b090);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b091);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_38.z);
        ::std::__cxx11::string::~string((string *)&val_38.z);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_b050);
      }
      ::std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::~vector
                ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                 local_aed8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(vector3d *)local_b0f0);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_b268);
      poVar2 = ::std::operator<<((ostream *)local_b268,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b2a8,"Failed to parse a value of type `{}`",&local_b2a9);
      tinyusdz::value::TypeTraits<tinyusdz::value::vector3d>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_b288,(string *)local_b2a8,local_b2d0);
      poVar2 = ::std::operator<<((ostream *)local_b268,(string *)local_b288);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_b288);
      ::std::__cxx11::string::~string((string *)local_b2d0);
      ::std::__cxx11::string::~string(local_b2a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b2a9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_39.
                      super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_39.
                  super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_b268);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::vector3d>
              ((MetaVariable *)local_a0,(vector3d *)local_b0f0);
    break;
  case 0x49:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
      vector((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *)
             local_d038);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2h>
                        (this,(vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                               *)local_d038);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                    *)local_d038);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_d1b0);
        poVar2 = ::std::operator<<((ostream *)local_d1b0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_d1f0,"Failed to parse a value of type `{}[]`",&local_d1f1);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_d1d0,(string *)local_d1f0,local_d218);
        poVar2 = ::std::operator<<((ostream *)local_d1b0,(string *)local_d1d0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_d1d0);
        ::std::__cxx11::string::~string((string *)local_d218);
        ::std::__cxx11::string::~string(local_d1f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d1f1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_d238);
        ::std::__cxx11::string::~string((string *)local_d238);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_d1b0);
      }
      ::std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
      ~vector((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *)
              local_d038);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_d23c);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_d3b8);
      poVar2 = ::std::operator<<((ostream *)local_d3b8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d3f8,"Failed to parse a value of type `{}`",&local_d3f9);
      tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2h>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_d3d8,(string *)local_d3f8,local_d420);
      poVar2 = ::std::operator<<((ostream *)local_d3b8,(string *)local_d3d8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_d3d8);
      ::std::__cxx11::string::~string((string *)local_d420);
      ::std::__cxx11::string::~string(local_d3f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_d3f9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_47.
                      super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_47.
                  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_d3b8);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord2h>((MetaVariable *)local_a0,&local_d23c);
    break;
  case 0x4a:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
      vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
             local_d458);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                        (this,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                               *)local_d458);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    *)local_d458);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_d5d0);
        poVar2 = ::std::operator<<((ostream *)local_d5d0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_d610,"Failed to parse a value of type `{}[]`",&local_d611);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_d5f0,(string *)local_d610,local_d638);
        poVar2 = ::std::operator<<((ostream *)local_d5d0,(string *)local_d5f0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_d5f0);
        ::std::__cxx11::string::~string((string *)local_d638);
        ::std::__cxx11::string::~string(local_d610);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d611);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_47);
        ::std::__cxx11::string::~string((string *)&val_47);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_d5d0);
      }
      ::std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
      ~vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
              local_d458);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_d660);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_d7d8);
      poVar2 = ::std::operator<<((ostream *)local_d7d8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d818,"Failed to parse a value of type `{}`",&local_d819);
      tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_d7f8,(string *)local_d818,local_d840);
      poVar2 = ::std::operator<<((ostream *)local_d7d8,(string *)local_d7f8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_d7f8);
      ::std::__cxx11::string::~string((string *)local_d840);
      ::std::__cxx11::string::~string(local_d818);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_d819);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_48.
                      super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_48.
                  super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_d7d8);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord2f>((MetaVariable *)local_a0,&local_d660);
    break;
  case 0x4b:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
      vector((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *)
             local_d878);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2d>
                        (this,(vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                               *)local_d878);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    *)local_d878);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_d9f0);
        poVar2 = ::std::operator<<((ostream *)local_d9f0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_da30,"Failed to parse a value of type `{}[]`",&local_da31);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_da10,(string *)local_da30,local_da58);
        poVar2 = ::std::operator<<((ostream *)local_d9f0,(string *)local_da10);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_da10);
        ::std::__cxx11::string::~string((string *)local_da58);
        ::std::__cxx11::string::~string(local_da30);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_da31);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_48.t);
        ::std::__cxx11::string::~string((string *)&val_48.t);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_d9f0);
      }
      ::std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
      ~vector((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *)
              local_d878);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(texcoord2d *)local_da88);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_dc00);
      poVar2 = ::std::operator<<((ostream *)local_dc00,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_dc40,"Failed to parse a value of type `{}`",&local_dc41);
      tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2d>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_dc20,(string *)local_dc40,local_dc68);
      poVar2 = ::std::operator<<((ostream *)local_dc00,(string *)local_dc20);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_dc20);
      ::std::__cxx11::string::~string((string *)local_dc68);
      ::std::__cxx11::string::~string(local_dc40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_dc41);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_49.
                      super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_49.
                  super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_dc00);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord2d>
              ((MetaVariable *)local_a0,(texcoord2d *)local_da88);
    break;
  case 0x4c:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
      vector((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *)
             local_dca0);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3h>
                        (this,(vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                               *)local_dca0);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                    *)local_dca0);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_de18);
        poVar2 = ::std::operator<<((ostream *)local_de18,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_de58,"Failed to parse a value of type `{}[]`",&local_de59);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_de38,(string *)local_de58,local_de80);
        poVar2 = ::std::operator<<((ostream *)local_de18,(string *)local_de38);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_de38);
        ::std::__cxx11::string::~string((string *)local_de80);
        ::std::__cxx11::string::~string(local_de58);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_de59);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_dea0);
        ::std::__cxx11::string::~string((string *)local_dea0);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_de18);
      }
      ::std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
      ~vector((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *)
              local_dca0);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,&local_dea6);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_e020);
      poVar2 = ::std::operator<<((ostream *)local_e020,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e060,"Failed to parse a value of type `{}`",&local_e061);
      tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3h>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_e040,(string *)local_e060,local_e088);
      poVar2 = ::std::operator<<((ostream *)local_e020,(string *)local_e040);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_e040);
      ::std::__cxx11::string::~string((string *)local_e088);
      ::std::__cxx11::string::~string(local_e060);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_e061);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_50.
                      super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_50.
                  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_e020);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord3h>((MetaVariable *)local_a0,&local_dea6);
    break;
  case 0x4d:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
      vector((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)
             local_e0c0);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                        (this,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                               *)local_e0c0);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                    *)local_e0c0);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_e238);
        poVar2 = ::std::operator<<((ostream *)local_e238,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_e278,"Failed to parse a value of type `{}[]`",&local_e279);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_e258,(string *)local_e278,local_e2a0);
        poVar2 = ::std::operator<<((ostream *)local_e238,(string *)local_e258);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_e258);
        ::std::__cxx11::string::~string((string *)local_e2a0);
        ::std::__cxx11::string::~string(local_e278);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_e279);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_50.t);
        ::std::__cxx11::string::~string((string *)&val_50.t);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_e238);
      }
      ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
      ~vector((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)
              local_e0c0);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(texcoord3f *)local_e2cc);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_e448);
      poVar2 = ::std::operator<<((ostream *)local_e448,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e488,"Failed to parse a value of type `{}`",&local_e489);
      tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3f>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_e468,(string *)local_e488,local_e4b0);
      poVar2 = ::std::operator<<((ostream *)local_e448,(string *)local_e468);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_e468);
      ::std::__cxx11::string::~string((string *)local_e4b0);
      ::std::__cxx11::string::~string(local_e488);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_e489);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &vss_51.
                      super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &vss_51.
                  super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_e448);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord3f>
              ((MetaVariable *)local_a0,(texcoord3f *)local_e2cc);
    break;
  case 0x4e:
    if ((local_a1 & 1) != 0) {
      ::std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
      vector((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *)
             local_e4e8);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3d>
                        (this,(vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                               *)local_e4e8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                    *)local_e4e8);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_e660);
        poVar2 = ::std::operator<<((ostream *)local_e660,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_e6a0,"Failed to parse a value of type `{}[]`",&local_e6a1);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_e680,(string *)local_e6a0,local_e6c8);
        poVar2 = ::std::operator<<((ostream *)local_e660,(string *)local_e680);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_e680);
        ::std::__cxx11::string::~string((string *)local_e6c8);
        ::std::__cxx11::string::~string(local_e6a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_e6a1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&val_51.r);
        ::std::__cxx11::string::~string((string *)&val_51.r);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_e660);
      }
      ::std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
      ~vector((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *)
              local_e4e8);
      goto joined_r0x004f0ae4;
    }
    bVar1 = ReadBasicType(this,(texcoord3d *)local_e700);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_e878);
      poVar2 = ::std::operator<<((ostream *)local_e878,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e8b8,"Failed to parse a value of type `{}`",&local_e8b9);
      tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3d>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_e898,(string *)local_e8b8,local_e8e0);
      poVar2 = ::std::operator<<((ostream *)local_e878,(string *)local_e898);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_e898);
      ::std::__cxx11::string::~string((string *)local_e8e0);
      ::std::__cxx11::string::~string(local_e8b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_e8b9);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &strs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &strs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_e878);
      goto LAB_004fce67;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord3d>
              ((MetaVariable *)local_a0,(texcoord3d *)local_e700);
    break;
  case 0x51:
    if ((local_a1 & 1) == 0) {
      tinyusdz::value::AssetPath::AssetPath((AssetPath *)local_ee58);
      bVar1 = ReadBasicType(this,(AssetPath *)local_ee58);
      if (bVar1) {
        MetaVariable::set_value<tinyusdz::value::AssetPath>
                  ((MetaVariable *)local_a0,(AssetPath *)local_ee58);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_efd0);
        poVar2 = ::std::operator<<((ostream *)local_efd0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xadc);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_efd0,"Failed to parse `asset`");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
        ::std::__cxx11::string::~string
                  ((string *)&dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_efd0);
      }
      tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_ee58);
    }
    else {
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::vector
                ((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                 local_ec80);
      bVar1 = ParseBasicTypeArray<tinyusdz::value::AssetPath>
                        (this,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                               *)local_ec80);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                  ((MetaVariable *)local_a0,
                   (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                    *)local_ec80);
        ref.contained._332_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_edf8);
        poVar2 = ::std::operator<<((ostream *)local_edf8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xad6);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_edf8,"Failed to parse `asset[]`");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)((long)&asset.resolved_path_.field_2 + 8));
        ::std::__cxx11::string::~string((string *)(asset.resolved_path_.field_2._M_local_buf + 8));
        this_local._7_1_ = 0;
        ref.contained._332_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_edf8);
      }
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
      ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
              local_ec80);
    }
joined_r0x004f0ae4:
    if (ref.contained._332_4_ != 0) goto LAB_004fce67;
    break;
  case 0x52:
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
           *)local_f020);
    bVar1 = ParseDict(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                            *)local_f020);
    if (bVar1) {
      MetaVariable::
      set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                ((MetaVariable *)local_a0,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  *)local_f020);
      ref.contained._332_4_ = 0xe;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_f198);
      poVar2 = ::std::operator<<((ostream *)local_f198,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseMetaValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xae7);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_f198,"Failed to parse `dictionary`");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)((long)&tyname.field_2 + 8));
      ::std::__cxx11::string::~string((string *)(tyname.field_2._M_local_buf + 8));
      this_local._7_1_ = 0;
      ref.contained._332_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_f198);
    }
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            *)local_f020);
    if (ref.contained._332_4_ != 0xe) goto LAB_004fce67;
  }
  MetaVariable::operator=(outvar,(MetaVariable *)local_a0);
  this_local._7_1_ = 1;
  ref.contained._332_4_ = 1;
LAB_004fce67:
  MetaVariable::~MetaVariable((MetaVariable *)local_a0);
  ::std::__cxx11::string::~string((string *)(var._name.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(varname.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseMetaValue(const VariableDef &def, MetaVariable *outvar) {
  std::string vartype = def.type;
  const std::string varname = def.name;

  MetaVariable var;

  bool array_qual{false};

  DCOUT("parseMeta: vartype " << vartype);

  if (endsWith(vartype, "[]")) {
    vartype = removeSuffix(vartype, "[]");
    array_qual = true;
  } else if (def.allow_array_type) {  // variable can be array
    // Seek '['
    char c;
    if (LookChar1(&c)) {
      if (c == '[') {
        array_qual = true;
      }
    }
  }

  uint32_t tyid = value::GetTypeId(vartype);

#define PARSE_BASE_TYPE(__ty)                                     \
  case value::TypeTraits<__ty>::type_id(): {                      \
    if (array_qual) {                                             \
      std::vector<__ty> vss;                                      \
      if (!ParseBasicTypeArray(&vss)) {                           \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}[]`", \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(vss);                                         \
    } else {                                                      \
      __ty val;                                                   \
      if (!ReadBasicType(&val)) {                                 \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}`",   \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(val);                                         \
    }                                                             \
    break;                                                        \
  }

  // Special treatment for "Reference" and "Payload"
  if (vartype == "Reference") {
    if (array_qual) {
      std::vector<Reference> refs;
      if (!ParseBasicTypeArray(&refs)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      var.set_value(refs);
    } else {
      nonstd::optional<Reference> ref;
      if (!ReadBasicType(&ref)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      if (ref) {
        var.set_value(ref.value());
      } else {
        // None
        var.set_value(value::ValueBlock());
      }
    }
  } else if (vartype == "Payload") {
    if (array_qual) {
      std::vector<Payload> refs;
      if (!ParseBasicTypeArray(&refs)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      var.set_value(refs);
    } else {
      nonstd::optional<Payload> ref;
      if (!ReadBasicType(&ref)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      if (ref) {
        var.set_value(ref.value());
      } else {
        // None
        var.set_value(value::ValueBlock());
      }
    }
  } else if (vartype == value::kPath) {
    if (array_qual) {
      std::vector<Path> paths;
      if (!ParseBasicTypeArray(&paths)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadatum.", def.name));
      }
      var.set_value(paths);

    } else {
      Path path;
      if (!ReadBasicType(&path)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadatum.", def.name));
      }
      var.set_value(path);
    }
  } else {
    switch (tyid) {
      APPLY_TO_METAVARIABLE_TYPE(PARSE_BASE_TYPE)
      case value::TYPE_ID_STRING: {
        if (array_qual) {
          std::vector<std::string> strs;
          if (!ParseBasicTypeArray(&strs)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `string[]`");
          }
          var.set_value(strs);
        } else {
          std::string str;
          if (!ReadBasicType(&str)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `string`");
          }
          var.set_value(str);
        }
        break;
      }
      case value::TYPE_ID_ASSET_PATH: {
        if (array_qual) {
          std::vector<value::AssetPath> arrs;
          if (!ParseBasicTypeArray(&arrs)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `asset[]`");
          }
          var.set_value(arrs);
        } else {
          value::AssetPath asset;
          if (!ReadBasicType(&asset)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `asset`");
          }
          var.set_value(asset);
        }
        break;
      }
      case value::TYPE_ID_DICT: {
        Dictionary dict;

        DCOUT("Parse dictionary");
        if (!ParseDict(&dict)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `dictionary`");
        }
        var.set_value(dict);
        break;
      }
      default: {
        std::string tyname = vartype;
        if (array_qual) {
          tyname += "[]";
        }
        PUSH_ERROR_AND_RETURN("Unsupported or invalid type for Metadatum:" +
                              tyname);
      }
    }
  }

#undef PARSE_BASE_TYPE

  (*outvar) = var;

  return true;
}